

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [12];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  byte unaff_BL;
  long lVar80;
  uint uVar81;
  undefined4 uVar82;
  ulong uVar83;
  float fVar84;
  float fVar86;
  undefined8 uVar87;
  vint4 bi_2;
  float fVar85;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 extraout_var [60];
  undefined1 auVar116 [64];
  undefined1 extraout_var_00 [60];
  float fVar117;
  float fVar151;
  float fVar152;
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar153;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar130 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar139 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar160 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 ai_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar210;
  float fVar211;
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [28];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar205 [16];
  undefined1 auVar209 [32];
  vint4 bi;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar240;
  float fVar248;
  float fVar249;
  undefined1 auVar241 [16];
  undefined1 auVar242 [28];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  vint4 ai_1;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar261;
  float fVar262;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 auVar264 [16];
  undefined1 auVar266 [64];
  float fVar267;
  float fVar270;
  float fVar271;
  undefined1 auVar268 [16];
  float fVar272;
  undefined1 auVar269 [32];
  undefined1 auVar273 [16];
  float fVar277;
  undefined1 auVar275 [32];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar276 [64];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  float fVar293;
  float fVar294;
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  float fVar295;
  undefined1 auVar292 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_b89;
  undefined1 local_b80 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  float local_ae8;
  float local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined8 *local_9e0;
  ulong local_9d8;
  RTCFilterFunctionNArguments local_9d0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [48];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 uStack_768;
  undefined4 uStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint local_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  RTCHitN local_620 [16];
  undefined1 auStack_610 [16];
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  uint local_5b0;
  uint uStack_5ac;
  uint uStack_5a8;
  uint uStack_5a4;
  uint uStack_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  undefined1 local_580 [32];
  ulong local_560;
  undefined1 auStack_558 [24];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar274 [16];
  
  PVar1 = prim[1];
  uVar79 = (ulong)(byte)PVar1;
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar202 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar202 = vinsertps_avx(auVar202,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar84 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar88._0_4_ = fVar84 * auVar96._0_4_;
  auVar88._4_4_ = fVar84 * auVar96._4_4_;
  auVar88._8_4_ = fVar84 * auVar96._8_4_;
  auVar88._12_4_ = fVar84 * auVar96._12_4_;
  auVar216._0_4_ = fVar84 * auVar202._0_4_;
  auVar216._4_4_ = fVar84 * auVar202._4_4_;
  auVar216._8_4_ = fVar84 * auVar202._8_4_;
  auVar216._12_4_ = fVar84 * auVar202._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar79 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  uVar78 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + uVar79 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar78 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar286._4_4_ = auVar216._0_4_;
  auVar286._0_4_ = auVar216._0_4_;
  auVar286._8_4_ = auVar216._0_4_;
  auVar286._12_4_ = auVar216._0_4_;
  auVar119 = vshufps_avx(auVar216,auVar216,0x55);
  auVar89 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar84 = auVar89._0_4_;
  auVar273._0_4_ = fVar84 * auVar5._0_4_;
  fVar117 = auVar89._4_4_;
  auVar273._4_4_ = fVar117 * auVar5._4_4_;
  fVar85 = auVar89._8_4_;
  auVar273._8_4_ = fVar85 * auVar5._8_4_;
  fVar151 = auVar89._12_4_;
  auVar273._12_4_ = fVar151 * auVar5._12_4_;
  auVar268._0_4_ = auVar7._0_4_ * fVar84;
  auVar268._4_4_ = auVar7._4_4_ * fVar117;
  auVar268._8_4_ = auVar7._8_4_ * fVar85;
  auVar268._12_4_ = auVar7._12_4_ * fVar151;
  auVar254._0_4_ = auVar157._0_4_ * fVar84;
  auVar254._4_4_ = auVar157._4_4_ * fVar117;
  auVar254._8_4_ = auVar157._8_4_ * fVar85;
  auVar254._12_4_ = auVar157._12_4_ * fVar151;
  auVar89 = vfmadd231ps_fma(auVar273,auVar119,auVar202);
  auVar120 = vfmadd231ps_fma(auVar268,auVar119,auVar127);
  auVar119 = vfmadd231ps_fma(auVar254,auVar90,auVar119);
  auVar175 = vfmadd231ps_fma(auVar89,auVar286,auVar96);
  auVar120 = vfmadd231ps_fma(auVar120,auVar286,auVar6);
  auVar200 = vfmadd231ps_fma(auVar119,auVar91,auVar286);
  auVar287._4_4_ = auVar88._0_4_;
  auVar287._0_4_ = auVar88._0_4_;
  auVar287._8_4_ = auVar88._0_4_;
  auVar287._12_4_ = auVar88._0_4_;
  auVar119 = vshufps_avx(auVar88,auVar88,0x55);
  auVar89 = vshufps_avx(auVar88,auVar88,0xaa);
  fVar84 = auVar89._0_4_;
  auVar217._0_4_ = fVar84 * auVar5._0_4_;
  fVar117 = auVar89._4_4_;
  auVar217._4_4_ = fVar117 * auVar5._4_4_;
  fVar85 = auVar89._8_4_;
  auVar217._8_4_ = fVar85 * auVar5._8_4_;
  fVar151 = auVar89._12_4_;
  auVar217._12_4_ = fVar151 * auVar5._12_4_;
  auVar118._0_4_ = auVar7._0_4_ * fVar84;
  auVar118._4_4_ = auVar7._4_4_ * fVar117;
  auVar118._8_4_ = auVar7._8_4_ * fVar85;
  auVar118._12_4_ = auVar7._12_4_ * fVar151;
  auVar89._0_4_ = auVar157._0_4_ * fVar84;
  auVar89._4_4_ = auVar157._4_4_ * fVar117;
  auVar89._8_4_ = auVar157._8_4_ * fVar85;
  auVar89._12_4_ = auVar157._12_4_ * fVar151;
  auVar202 = vfmadd231ps_fma(auVar217,auVar119,auVar202);
  auVar5 = vfmadd231ps_fma(auVar118,auVar119,auVar127);
  auVar127 = vfmadd231ps_fma(auVar89,auVar119,auVar90);
  auVar7 = vfmadd231ps_fma(auVar202,auVar287,auVar96);
  auVar90 = vfmadd231ps_fma(auVar5,auVar287,auVar6);
  auVar157 = vfmadd231ps_fma(auVar127,auVar287,auVar91);
  local_8a0._8_4_ = 0x7fffffff;
  local_8a0._0_8_ = 0x7fffffff7fffffff;
  local_8a0._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar175,local_8a0);
  auVar199._8_4_ = 0x219392ef;
  auVar199._0_8_ = 0x219392ef219392ef;
  auVar199._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar199,1);
  auVar202 = vblendvps_avx(auVar175,auVar199,auVar96);
  auVar96 = vandps_avx(auVar120,local_8a0);
  auVar96 = vcmpps_avx(auVar96,auVar199,1);
  auVar5 = vblendvps_avx(auVar120,auVar199,auVar96);
  auVar96 = vandps_avx(auVar200,local_8a0);
  auVar96 = vcmpps_avx(auVar96,auVar199,1);
  auVar96 = vblendvps_avx(auVar200,auVar199,auVar96);
  auVar6 = vrcpps_avx(auVar202);
  auVar241._8_4_ = 0x3f800000;
  auVar241._0_8_ = &DAT_3f8000003f800000;
  auVar241._12_4_ = 0x3f800000;
  auVar202 = vfnmadd213ps_fma(auVar202,auVar6,auVar241);
  auVar6 = vfmadd132ps_fma(auVar202,auVar6,auVar6);
  auVar202 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar202,auVar241);
  auVar127 = vfmadd132ps_fma(auVar5,auVar202,auVar202);
  auVar202 = vrcpps_avx(auVar96);
  auVar5 = vfnmadd213ps_fma(auVar96,auVar202,auVar241);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar91 = vfmadd132ps_fma(auVar5,auVar202,auVar202);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar7);
  auVar200._0_4_ = auVar6._0_4_ * auVar96._0_4_;
  auVar200._4_4_ = auVar6._4_4_ * auVar96._4_4_;
  auVar200._8_4_ = auVar6._8_4_ * auVar96._8_4_;
  auVar200._12_4_ = auVar6._12_4_ * auVar96._12_4_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar202);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar7);
  auVar218._0_4_ = auVar6._0_4_ * auVar96._0_4_;
  auVar218._4_4_ = auVar6._4_4_ * auVar96._4_4_;
  auVar218._8_4_ = auVar6._8_4_ * auVar96._8_4_;
  auVar218._12_4_ = auVar6._12_4_ * auVar96._12_4_;
  auVar120._1_3_ = 0;
  auVar120[0] = PVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar202 = vpmovsxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar79 * -2 + 6);
  auVar96 = vpmovsxwd_avx(auVar6);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar90);
  auVar255._0_4_ = auVar96._0_4_ * auVar127._0_4_;
  auVar255._4_4_ = auVar96._4_4_ * auVar127._4_4_;
  auVar255._8_4_ = auVar96._8_4_ * auVar127._8_4_;
  auVar255._12_4_ = auVar96._12_4_ * auVar127._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar202);
  auVar96 = vsubps_avx(auVar96,auVar90);
  auVar119._0_4_ = auVar127._0_4_ * auVar96._0_4_;
  auVar119._4_4_ = auVar127._4_4_ * auVar96._4_4_;
  auVar119._8_4_ = auVar127._8_4_ * auVar96._8_4_;
  auVar119._12_4_ = auVar127._12_4_ * auVar96._12_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar78 + uVar79 + 6);
  auVar96 = vpmovsxwd_avx(auVar127);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar157);
  auVar175._0_4_ = auVar91._0_4_ * auVar96._0_4_;
  auVar175._4_4_ = auVar91._4_4_ * auVar96._4_4_;
  auVar175._8_4_ = auVar91._8_4_ * auVar96._8_4_;
  auVar175._12_4_ = auVar91._12_4_ * auVar96._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar7);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar157);
  auVar90._0_4_ = auVar91._0_4_ * auVar96._0_4_;
  auVar90._4_4_ = auVar91._4_4_ * auVar96._4_4_;
  auVar90._8_4_ = auVar91._8_4_ * auVar96._8_4_;
  auVar90._12_4_ = auVar91._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar200,auVar218);
  auVar202 = vpminsd_avx(auVar255,auVar119);
  auVar96 = vmaxps_avx(auVar96,auVar202);
  auVar202 = vpminsd_avx(auVar175,auVar90);
  uVar82 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar263._4_4_ = uVar82;
  auVar263._0_4_ = uVar82;
  auVar263._8_4_ = uVar82;
  auVar263._12_4_ = uVar82;
  auVar202 = vmaxps_avx(auVar202,auVar263);
  auVar96 = vmaxps_avx(auVar96,auVar202);
  local_410._0_4_ = auVar96._0_4_ * 0.99999964;
  local_410._4_4_ = auVar96._4_4_ * 0.99999964;
  local_410._8_4_ = auVar96._8_4_ * 0.99999964;
  local_410._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar200,auVar218);
  auVar202 = vpmaxsd_avx(auVar255,auVar119);
  auVar96 = vminps_avx(auVar96,auVar202);
  auVar202 = vpmaxsd_avx(auVar175,auVar90);
  uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = uVar82;
  auVar157._0_4_ = uVar82;
  auVar157._8_4_ = uVar82;
  auVar157._12_4_ = uVar82;
  auVar202 = vminps_avx(auVar202,auVar157);
  auVar96 = vminps_avx(auVar96,auVar202);
  auVar91._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar120[4] = PVar1;
  auVar120._5_3_ = 0;
  auVar120[8] = PVar1;
  auVar120._9_3_ = 0;
  auVar120[0xc] = PVar1;
  auVar120._13_3_ = 0;
  auVar202 = vpcmpgtd_avx(auVar120,_DAT_01ff0cf0);
  auVar96 = vcmpps_avx(local_410,auVar91,2);
  auVar96 = vandps_avx(auVar96,auVar202);
  uVar76 = vmovmskps_avx(auVar96);
  local_b89 = uVar76 != 0;
  if (uVar76 == 0) {
    return local_b89;
  }
  uVar76 = uVar76 & 0xff;
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_260 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  local_9e0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_780 = 0x7fffffff;
  uStack_77c = 0x7fffffff;
  uStack_778 = 0x7fffffff;
  uStack_774 = 0x7fffffff;
  uStack_770 = 0x7fffffff;
  uStack_76c = 0x7fffffff;
  uStack_768 = 0x7fffffff;
  uStack_764 = 0x7fffffff;
  local_7f0 = prim;
LAB_0168fcfd:
  lVar80 = 0;
  local_7e8 = (ulong)uVar76;
  for (uVar78 = local_7e8; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  local_630 = *(uint *)(local_7f0 + 2);
  local_9d8 = (ulong)local_630;
  local_640 = *(uint *)(local_7f0 + lVar80 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[local_9d8].ptr;
  lVar80 = *(long *)&pGVar2[1].time_range.upper;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           (ulong)local_640 *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar96 = *(undefined1 (*) [16])(lVar80 + (long)pGVar2[1].intersectionFilterN * uVar78);
  auVar202 = *(undefined1 (*) [16])(lVar80 + (long)pGVar2[1].intersectionFilterN * (uVar78 + 1));
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar82 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar288._4_4_ = uVar82;
  auVar288._0_4_ = uVar82;
  auVar288._8_4_ = uVar82;
  auVar288._12_4_ = uVar82;
  fStack_ab0 = (float)uVar82;
  _local_ac0 = auVar288;
  fStack_aac = (float)uVar82;
  fStack_aa8 = (float)uVar82;
  register0x0000159c = uVar82;
  uVar82 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar290._4_4_ = uVar82;
  auVar290._0_4_ = uVar82;
  auVar290._8_4_ = uVar82;
  auVar290._12_4_ = uVar82;
  fStack_950 = (float)uVar82;
  _local_960 = auVar290;
  fStack_94c = (float)uVar82;
  fStack_948 = (float)uVar82;
  register0x000015dc = uVar82;
  auVar5 = vunpcklps_avx(auVar288,auVar290);
  fVar84 = *(float *)(ray + k * 4 + 0x60);
  auVar274._4_4_ = fVar84;
  auVar274._0_4_ = fVar84;
  auVar274._8_4_ = fVar84;
  auVar274._12_4_ = fVar84;
  local_980._16_4_ = fVar84;
  local_980._0_16_ = auVar274;
  local_980._20_4_ = fVar84;
  local_980._24_4_ = fVar84;
  local_980._28_4_ = fVar84;
  auVar276 = ZEXT3264(local_980);
  local_890 = vinsertps_avx(auVar5,auVar274,0x28);
  auVar219._8_4_ = 0xbeaaaaab;
  auVar219._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar219._12_4_ = 0xbeaaaaab;
  auVar91 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              uVar78 * (long)pGVar2[2].pointQueryFunc),auVar96,auVar219);
  auVar7 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar2[2].intersectionFilterN +
                            (long)pGVar2[2].pointQueryFunc * (uVar78 + 1)),auVar202,auVar219);
  auVar220._0_4_ = (auVar202._0_4_ + auVar96._0_4_ + auVar91._0_4_ + auVar7._0_4_) * 0.25;
  auVar220._4_4_ = (auVar202._4_4_ + auVar96._4_4_ + auVar91._4_4_ + auVar7._4_4_) * 0.25;
  auVar220._8_4_ = (auVar202._8_4_ + auVar96._8_4_ + auVar91._8_4_ + auVar7._8_4_) * 0.25;
  auVar220._12_4_ = (auVar202._12_4_ + auVar96._12_4_ + auVar91._12_4_ + auVar7._12_4_) * 0.25;
  auVar5 = vsubps_avx(auVar220,auVar6);
  auVar5 = vdpps_avx(auVar5,local_890,0x7f);
  local_8b0 = vdpps_avx(local_890,local_890,0x7f);
  auVar266 = ZEXT1664(local_8b0);
  auVar127 = vrcpss_avx(local_8b0,local_8b0);
  auVar90 = vfnmadd213ss_fma(auVar127,local_8b0,ZEXT416(0x40000000));
  local_300 = auVar5._0_4_ * auVar127._0_4_ * auVar90._0_4_;
  auVar234._4_4_ = local_300;
  auVar234._0_4_ = local_300;
  auVar234._8_4_ = local_300;
  auVar234._12_4_ = local_300;
  fStack_850 = local_300;
  _local_860 = auVar234;
  fStack_84c = local_300;
  fStack_848 = local_300;
  fStack_844 = local_300;
  auVar5 = vfmadd231ps_fma(auVar6,local_890,auVar234);
  auVar5 = vblendps_avx(auVar5,_DAT_01feba10,8);
  local_a50 = vsubps_avx(auVar96,auVar5);
  local_a60 = vsubps_avx(auVar7,auVar5);
  local_a70 = vsubps_avx(auVar91,auVar5);
  _local_a80 = vsubps_avx(auVar202,auVar5);
  auVar96 = vmovshdup_avx(local_a50);
  uVar87 = auVar96._0_8_;
  local_880._8_8_ = uVar87;
  local_880._0_8_ = uVar87;
  local_880._16_8_ = uVar87;
  local_880._24_8_ = uVar87;
  auVar96 = vshufps_avx(local_a50,local_a50,0xaa);
  local_540 = auVar96._0_8_;
  auVar96 = vshufps_avx(local_a50,local_a50,0xff);
  uVar87 = auVar96._0_8_;
  auVar140._8_8_ = uVar87;
  auVar140._0_8_ = uVar87;
  auVar140._16_8_ = uVar87;
  auVar140._24_8_ = uVar87;
  auVar96 = vmovshdup_avx(local_a70);
  uVar87 = auVar96._0_8_;
  local_280._8_8_ = uVar87;
  local_280._0_8_ = uVar87;
  local_280._16_8_ = uVar87;
  local_280._24_8_ = uVar87;
  auVar96 = vshufps_avx(local_a70,local_a70,0xaa);
  uVar87 = auVar96._0_8_;
  local_a20._8_8_ = uVar87;
  local_a20._0_8_ = uVar87;
  local_a20._16_8_ = uVar87;
  local_a20._24_8_ = uVar87;
  auVar282 = ZEXT3264(local_a20);
  auVar96 = vshufps_avx(local_a70,local_a70,0xff);
  uVar87 = auVar96._0_8_;
  local_2a0._8_8_ = uVar87;
  local_2a0._0_8_ = uVar87;
  local_2a0._16_8_ = uVar87;
  local_2a0._24_8_ = uVar87;
  auVar96 = vmovshdup_avx(local_a60);
  local_1a0 = auVar96._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar96 = vshufps_avx(local_a60,local_a60,0xaa);
  uVar87 = auVar96._0_8_;
  auVar102._8_8_ = uVar87;
  auVar102._0_8_ = uVar87;
  auVar102._16_8_ = uVar87;
  auVar102._24_8_ = uVar87;
  auVar96 = vshufps_avx(local_a60,local_a60,0xff);
  local_3c0 = auVar96._0_4_;
  fStack_3bc = auVar96._4_4_;
  auVar96 = vmovshdup_avx(_local_a80);
  local_1c0 = auVar96._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar96 = vshufps_avx(_local_a80,_local_a80,0xaa);
  local_1e0 = auVar96._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar96 = vshufps_avx(_local_a80,_local_a80,0xff);
  local_200 = auVar96._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar96 = vfmadd231ps_fma(ZEXT432((uint)(fVar84 * fVar84)),_local_960,_local_960);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),_local_ac0,_local_ac0);
  uVar82 = auVar96._0_4_;
  local_220._4_4_ = uVar82;
  local_220._0_4_ = uVar82;
  local_220._8_4_ = uVar82;
  local_220._12_4_ = uVar82;
  local_220._16_4_ = uVar82;
  local_220._20_4_ = uVar82;
  local_220._24_4_ = uVar82;
  local_220._28_4_ = uVar82;
  fVar84 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)local_300);
  local_300 = fVar84 - local_300;
  auVar233 = ZEXT3264(local_880);
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  uVar78 = 0;
  uVar79 = 0;
  local_560 = 1;
  local_2c0._0_4_ = local_a50._0_4_;
  local_2c0._4_4_ = local_2c0._0_4_;
  local_2c0._8_4_ = local_2c0._0_4_;
  local_2c0._12_4_ = local_2c0._0_4_;
  local_2c0._16_4_ = local_2c0._0_4_;
  local_2c0._20_4_ = local_2c0._0_4_;
  local_2c0._24_4_ = local_2c0._0_4_;
  local_2c0._28_4_ = local_2c0._0_4_;
  uVar82 = local_a70._0_4_;
  local_2e0._4_4_ = uVar82;
  local_2e0._0_4_ = uVar82;
  local_2e0._8_4_ = uVar82;
  local_2e0._12_4_ = uVar82;
  local_2e0._16_4_ = uVar82;
  local_2e0._20_4_ = uVar82;
  local_2e0._24_4_ = uVar82;
  local_2e0._28_4_ = uVar82;
  auVar10._8_8_ = local_540;
  auVar10._0_8_ = local_540;
  auVar10._16_8_ = local_540;
  auVar10._24_8_ = local_540;
  local_3e0 = local_a60._0_4_;
  local_240 = local_a80._0_4_;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  auVar11._4_4_ = uStack_77c;
  auVar11._0_4_ = local_780;
  auVar11._8_4_ = uStack_778;
  auVar11._12_4_ = uStack_774;
  auVar11._16_4_ = uStack_770;
  auVar11._20_4_ = uStack_76c;
  auVar11._24_4_ = uStack_768;
  auVar11._28_4_ = uStack_764;
  local_400 = vandps_avx(local_220,auVar11);
  auVar96 = vsqrtss_avx(local_8b0,local_8b0);
  local_ae4 = auVar96._0_4_;
  auVar96 = vsqrtss_avx(local_8b0,local_8b0);
  local_ae8 = auVar96._0_4_;
  local_800 = ZEXT816(0x3f80000000000000);
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_ae0 = auVar102;
  local_a00 = auVar140;
  uStack_63c = local_640;
  uStack_638 = local_640;
  uStack_634 = local_640;
  uStack_62c = local_630;
  uStack_628 = local_630;
  uStack_624 = local_630;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  fStack_3b8 = local_3c0;
  fStack_3b4 = fStack_3bc;
  fStack_3b0 = local_3c0;
  fStack_3ac = fStack_3bc;
  fStack_3a8 = local_3c0;
  fStack_3a4 = fStack_3bc;
  do {
    auVar96 = vmovshdup_avx(local_800);
    local_680._0_4_ = local_800._0_4_;
    fVar152 = auVar96._0_4_ - (float)local_680._0_4_;
    fVar156 = fVar152 * 0.04761905;
    local_680._4_4_ = local_680._0_4_;
    local_680._8_4_ = local_680._0_4_;
    local_680._12_4_ = local_680._0_4_;
    local_680._16_4_ = local_680._0_4_;
    local_680._20_4_ = local_680._0_4_;
    local_680._24_4_ = local_680._0_4_;
    local_680._28_4_ = local_680._0_4_;
    local_9a0._4_4_ = fVar152;
    local_9a0._0_4_ = fVar152;
    local_9a0._8_4_ = fVar152;
    local_9a0._12_4_ = fVar152;
    local_9a0._16_4_ = fVar152;
    local_9a0._20_4_ = fVar152;
    local_9a0._24_4_ = fVar152;
    local_9a0._28_4_ = fVar152;
    auVar96 = vfmadd231ps_fma(local_680,local_9a0,_DAT_02020f20);
    auVar141._8_4_ = 0x3f800000;
    auVar141._0_8_ = &DAT_3f8000003f800000;
    auVar141._12_4_ = 0x3f800000;
    auVar141._16_4_ = 0x3f800000;
    auVar141._20_4_ = 0x3f800000;
    auVar141._24_4_ = 0x3f800000;
    auVar141._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar141,ZEXT1632(auVar96));
    fVar117 = auVar96._0_4_;
    auVar239._0_4_ = local_2e0._0_4_ * fVar117;
    fVar85 = auVar96._4_4_;
    auVar239._4_4_ = local_2e0._4_4_ * fVar85;
    fVar151 = auVar96._8_4_;
    auVar239._8_4_ = local_2e0._8_4_ * fVar151;
    fVar86 = auVar96._12_4_;
    auVar239._12_4_ = local_2e0._12_4_ * fVar86;
    auVar239._16_4_ = local_2e0._16_4_ * 0.0;
    auVar239._20_4_ = local_2e0._20_4_ * 0.0;
    auVar239._28_36_ = auVar276._28_36_;
    auVar239._24_4_ = local_2e0._24_4_ * 0.0;
    auVar164._4_4_ = local_280._4_4_ * fVar85;
    auVar164._0_4_ = local_280._0_4_ * fVar117;
    auVar164._8_4_ = local_280._8_4_ * fVar151;
    auVar164._12_4_ = local_280._12_4_ * fVar86;
    auVar164._16_4_ = local_280._16_4_ * 0.0;
    auVar164._20_4_ = local_280._20_4_ * 0.0;
    auVar164._24_4_ = local_280._24_4_ * 0.0;
    auVar164._28_4_ = fVar152;
    auVar276._0_4_ = auVar282._0_4_ * fVar117;
    auVar276._4_4_ = auVar282._4_4_ * fVar85;
    auVar276._8_4_ = auVar282._8_4_ * fVar151;
    auVar276._12_4_ = auVar282._12_4_ * fVar86;
    auVar276._16_4_ = auVar282._16_4_ * 0.0;
    auVar276._20_4_ = auVar282._20_4_ * 0.0;
    auVar276._28_36_ = auVar266._28_36_;
    auVar276._24_4_ = auVar282._24_4_ * 0.0;
    auVar194._4_4_ = local_2a0._4_4_ * fVar85;
    auVar194._0_4_ = local_2a0._0_4_ * fVar117;
    auVar194._8_4_ = local_2a0._8_4_ * fVar151;
    auVar194._12_4_ = local_2a0._12_4_ * fVar86;
    auVar194._16_4_ = local_2a0._16_4_ * 0.0;
    auVar194._20_4_ = local_2a0._20_4_ * 0.0;
    auVar194._24_4_ = local_2a0._24_4_ * 0.0;
    auVar194._28_4_ = local_2a0._28_4_;
    auVar96 = vfmadd231ps_fma(auVar239._0_32_,auVar110,local_2c0);
    auVar202 = vfmadd231ps_fma(auVar164,auVar110,auVar233._0_32_);
    auVar5 = vfmadd231ps_fma(auVar276._0_32_,auVar110,auVar10);
    auVar6 = vfmadd231ps_fma(auVar194,auVar110,auVar140);
    auVar166._4_4_ = fStack_3dc * fVar85;
    auVar166._0_4_ = local_3e0 * fVar117;
    auVar166._8_4_ = fStack_3d8 * fVar151;
    auVar166._12_4_ = fStack_3d4 * fVar86;
    auVar166._16_4_ = fStack_3d0 * 0.0;
    auVar166._20_4_ = fStack_3cc * 0.0;
    auVar166._24_4_ = fStack_3c8 * 0.0;
    auVar166._28_4_ = local_2c0._28_4_;
    auVar72._8_8_ = uStack_198;
    auVar72._0_8_ = local_1a0;
    auVar72._16_8_ = uStack_190;
    auVar72._24_8_ = uStack_188;
    auVar266._0_4_ = (float)local_1a0 * fVar117;
    auVar266._4_4_ = (float)((ulong)local_1a0 >> 0x20) * fVar85;
    auVar266._8_4_ = (float)uStack_198 * fVar151;
    auVar266._12_4_ = (float)((ulong)uStack_198 >> 0x20) * fVar86;
    auVar266._16_4_ = (float)uStack_190 * 0.0;
    auVar266._20_4_ = (float)((ulong)uStack_190 >> 0x20) * 0.0;
    auVar266._28_36_ = auVar233._28_36_;
    auVar266._24_4_ = (float)uStack_188 * 0.0;
    auVar12._4_4_ = auVar102._4_4_ * fVar85;
    auVar12._0_4_ = auVar102._0_4_ * fVar117;
    auVar12._8_4_ = auVar102._8_4_ * fVar151;
    auVar12._12_4_ = auVar102._12_4_ * fVar86;
    auVar12._16_4_ = auVar102._16_4_ * 0.0;
    auVar12._20_4_ = auVar102._20_4_ * 0.0;
    auVar12._24_4_ = auVar102._24_4_ * 0.0;
    auVar12._28_4_ = fStack_3c4;
    auVar100._4_4_ = fVar85 * fStack_3bc;
    auVar100._0_4_ = fVar117 * local_3c0;
    auVar100._8_4_ = fVar151 * fStack_3b8;
    auVar100._12_4_ = fVar86 * fStack_3b4;
    auVar100._16_4_ = fStack_3b0 * 0.0;
    auVar100._20_4_ = fStack_3ac * 0.0;
    auVar100._24_4_ = fStack_3a8 * 0.0;
    auVar100._28_4_ = auVar10._28_4_;
    auVar127 = vfmadd231ps_fma(auVar166,auVar110,local_2e0);
    auVar7 = vfmadd231ps_fma(auVar266._0_32_,auVar110,local_280);
    auVar91 = vfmadd231ps_fma(auVar12,auVar110,auVar282._0_32_);
    auVar90 = vfmadd231ps_fma(auVar100,auVar110,local_2a0);
    auVar283._0_4_ = fVar117 * local_240;
    auVar283._4_4_ = fVar85 * fStack_23c;
    auVar283._8_4_ = fVar151 * fStack_238;
    auVar283._12_4_ = fVar86 * fStack_234;
    auVar283._16_4_ = fStack_230 * 0.0;
    auVar283._20_4_ = fStack_22c * 0.0;
    auVar283._24_4_ = fStack_228 * 0.0;
    auVar283._28_4_ = 0;
    auVar233._0_4_ = fVar117 * (float)local_1c0;
    auVar233._4_4_ = fVar85 * local_1c0._4_4_;
    auVar233._8_4_ = fVar151 * (float)uStack_1b8;
    auVar233._12_4_ = fVar86 * uStack_1b8._4_4_;
    auVar233._16_4_ = (float)uStack_1b0 * 0.0;
    auVar233._20_4_ = uStack_1b0._4_4_ * 0.0;
    auVar233._28_36_ = auVar282._28_36_;
    auVar233._24_4_ = (float)uStack_1a8 * 0.0;
    auVar228._28_4_ = local_2a0._28_4_;
    auVar228._0_28_ =
         ZEXT1628(CONCAT412(auVar127._12_4_ * fVar86,
                            CONCAT48(auVar127._8_4_ * fVar151,
                                     CONCAT44(auVar127._4_4_ * fVar85,auVar127._0_4_ * fVar117))));
    auVar96 = vfmadd231ps_fma(auVar228,auVar110,ZEXT1632(auVar96));
    auVar202 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar7._12_4_,
                                                  CONCAT48(fVar151 * auVar7._8_4_,
                                                           CONCAT44(fVar85 * auVar7._4_4_,
                                                                    fVar117 * auVar7._0_4_)))),
                               auVar110,ZEXT1632(auVar202));
    auVar193._28_4_ = local_2e0._28_4_;
    auVar193._0_28_ =
         ZEXT1628(CONCAT412(fVar86 * auVar91._12_4_,
                            CONCAT48(fVar151 * auVar91._8_4_,
                                     CONCAT44(fVar85 * auVar91._4_4_,fVar117 * auVar91._0_4_))));
    auVar5 = vfmadd231ps_fma(auVar193,auVar110,ZEXT1632(auVar5));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar90._12_4_,
                                                CONCAT48(fVar151 * auVar90._8_4_,
                                                         CONCAT44(fVar85 * auVar90._4_4_,
                                                                  fVar117 * auVar90._0_4_)))),
                             auVar110,ZEXT1632(auVar6));
    auVar13._4_4_ = fVar85 * local_1e0._4_4_;
    auVar13._0_4_ = fVar117 * (float)local_1e0;
    auVar13._8_4_ = fVar151 * (float)uStack_1d8;
    auVar13._12_4_ = fVar86 * uStack_1d8._4_4_;
    auVar13._16_4_ = (float)uStack_1d0 * 0.0;
    auVar13._20_4_ = uStack_1d0._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_1c8 * 0.0;
    auVar13._28_4_ = local_280._28_4_;
    auVar190._4_4_ = fStack_3dc;
    auVar190._0_4_ = local_3e0;
    auVar190._8_4_ = fStack_3d8;
    auVar190._12_4_ = fStack_3d4;
    auVar190._16_4_ = fStack_3d0;
    auVar190._20_4_ = fStack_3cc;
    auVar190._24_4_ = fStack_3c8;
    auVar190._28_4_ = fStack_3c4;
    auVar157 = vfmadd231ps_fma(auVar283,auVar110,auVar190);
    auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar157._12_4_ * fVar86,
                                                  CONCAT48(auVar157._8_4_ * fVar151,
                                                           CONCAT44(auVar157._4_4_ * fVar85,
                                                                    auVar157._0_4_ * fVar117)))),
                               auVar110,ZEXT1632(auVar127));
    auVar257._0_4_ = fVar117 * (float)local_200;
    auVar257._4_4_ = fVar85 * local_200._4_4_;
    auVar257._8_4_ = fVar151 * (float)uStack_1f8;
    auVar257._12_4_ = fVar86 * uStack_1f8._4_4_;
    auVar257._16_4_ = (float)uStack_1f0 * 0.0;
    auVar257._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar257._24_4_ = (float)uStack_1e8 * 0.0;
    auVar257._28_4_ = 0;
    auVar157 = vfmadd231ps_fma(auVar233._0_32_,auVar110,auVar72);
    auVar119 = vfmadd231ps_fma(auVar13,auVar110,auVar102);
    auVar70._4_4_ = fStack_3bc;
    auVar70._0_4_ = local_3c0;
    auVar70._8_4_ = fStack_3b8;
    auVar70._12_4_ = fStack_3b4;
    auVar70._16_4_ = fStack_3b0;
    auVar70._20_4_ = fStack_3ac;
    auVar70._24_4_ = fStack_3a8;
    auVar70._28_4_ = fStack_3a4;
    auVar89 = vfmadd231ps_fma(auVar257,auVar110,auVar70);
    auVar14._28_4_ = auVar102._28_4_;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(auVar89._12_4_ * fVar86,
                            CONCAT48(auVar89._8_4_ * fVar151,
                                     CONCAT44(auVar89._4_4_ * fVar85,auVar89._0_4_ * fVar117))));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar157._12_4_ * fVar86,
                                                CONCAT48(auVar157._8_4_ * fVar151,
                                                         CONCAT44(auVar157._4_4_ * fVar85,
                                                                  auVar157._0_4_ * fVar117)))),
                             auVar110,ZEXT1632(auVar7));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar119._12_4_,
                                                 CONCAT48(fVar151 * auVar119._8_4_,
                                                          CONCAT44(fVar85 * auVar119._4_4_,
                                                                   fVar117 * auVar119._0_4_)))),
                              auVar110,ZEXT1632(auVar91));
    auVar90 = vfmadd231ps_fma(auVar14,auVar110,ZEXT1632(auVar90));
    auVar15._28_4_ = (int)((ulong)uStack_188 >> 0x20);
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(fVar86 * auVar91._12_4_,
                            CONCAT48(fVar151 * auVar91._8_4_,
                                     CONCAT44(fVar85 * auVar91._4_4_,fVar117 * auVar91._0_4_))));
    auVar157 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar127._12_4_ * fVar86,
                                                  CONCAT48(auVar127._8_4_ * fVar151,
                                                           CONCAT44(auVar127._4_4_ * fVar85,
                                                                    auVar127._0_4_ * fVar117)))),
                               auVar110,ZEXT1632(auVar96));
    auVar119 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * fVar86,
                                                  CONCAT48(auVar7._8_4_ * fVar151,
                                                           CONCAT44(auVar7._4_4_ * fVar85,
                                                                    auVar7._0_4_ * fVar117)))),
                               auVar110,ZEXT1632(auVar202));
    auVar100 = ZEXT1632(auVar119);
    auVar119 = vfmadd231ps_fma(auVar15,auVar110,ZEXT1632(auVar5));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar90._12_4_ * fVar86,
                                                 CONCAT48(auVar90._8_4_ * fVar151,
                                                          CONCAT44(auVar90._4_4_ * fVar85,
                                                                   auVar90._0_4_ * fVar117)))),
                              ZEXT1632(auVar6),auVar110);
    auVar10 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar96));
    auVar110 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar202));
    auVar102 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar5));
    auVar140 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar6));
    auVar235._0_4_ = fVar156 * auVar10._0_4_ * 3.0;
    auVar235._4_4_ = fVar156 * auVar10._4_4_ * 3.0;
    auVar235._8_4_ = fVar156 * auVar10._8_4_ * 3.0;
    auVar235._12_4_ = fVar156 * auVar10._12_4_ * 3.0;
    auVar235._16_4_ = fVar156 * auVar10._16_4_ * 3.0;
    auVar235._20_4_ = fVar156 * auVar10._20_4_ * 3.0;
    auVar235._24_4_ = fVar156 * auVar10._24_4_ * 3.0;
    auVar235._28_4_ = 0;
    local_a40._0_4_ = fVar156 * auVar110._0_4_ * 3.0;
    local_a40._4_4_ = fVar156 * auVar110._4_4_ * 3.0;
    local_a40._8_4_ = fVar156 * auVar110._8_4_ * 3.0;
    local_a40._12_4_ = fVar156 * auVar110._12_4_ * 3.0;
    local_a40._16_4_ = fVar156 * auVar110._16_4_ * 3.0;
    local_a40._20_4_ = fVar156 * auVar110._20_4_ * 3.0;
    local_a40._24_4_ = fVar156 * auVar110._24_4_ * 3.0;
    local_a40._28_4_ = 0;
    local_940._0_4_ = fVar156 * auVar102._0_4_ * 3.0;
    local_940._4_4_ = fVar156 * auVar102._4_4_ * 3.0;
    local_940._8_4_ = fVar156 * auVar102._8_4_ * 3.0;
    local_940._12_4_ = fVar156 * auVar102._12_4_ * 3.0;
    local_940._16_4_ = fVar156 * auVar102._16_4_ * 3.0;
    local_940._20_4_ = fVar156 * auVar102._20_4_ * 3.0;
    local_940._24_4_ = fVar156 * auVar102._24_4_ * 3.0;
    local_940._28_4_ = 0;
    fVar117 = fVar156 * auVar140._0_4_ * 3.0;
    fVar151 = fVar156 * auVar140._4_4_ * 3.0;
    auVar103._4_4_ = fVar151;
    auVar103._0_4_ = fVar117;
    fVar152 = fVar156 * auVar140._8_4_ * 3.0;
    auVar103._8_4_ = fVar152;
    fVar153 = fVar156 * auVar140._12_4_ * 3.0;
    auVar103._12_4_ = fVar153;
    fVar154 = fVar156 * auVar140._16_4_ * 3.0;
    auVar103._16_4_ = fVar154;
    fVar155 = fVar156 * auVar140._20_4_ * 3.0;
    auVar103._20_4_ = fVar155;
    fVar156 = fVar156 * auVar140._24_4_ * 3.0;
    auVar103._24_4_ = fVar156;
    auVar103._28_4_ = auVar10._28_4_;
    auVar190 = ZEXT1632(auVar157);
    auVar13 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar157));
    auVar14 = vpermps_avx2(_DAT_0205d4a0,auVar100);
    local_840._0_32_ = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar119));
    auVar11 = vsubps_avx(auVar13,auVar190);
    auVar164 = vsubps_avx(local_840._0_32_,ZEXT1632(auVar119));
    fVar171 = auVar164._0_4_;
    fVar172 = auVar164._4_4_;
    auVar269._4_4_ = fVar172 * auVar235._4_4_;
    auVar269._0_4_ = fVar171 * auVar235._0_4_;
    fVar173 = auVar164._8_4_;
    auVar269._8_4_ = fVar173 * auVar235._8_4_;
    fVar174 = auVar164._12_4_;
    auVar269._12_4_ = fVar174 * auVar235._12_4_;
    fVar214 = auVar164._16_4_;
    auVar269._16_4_ = fVar214 * auVar235._16_4_;
    fVar215 = auVar164._20_4_;
    auVar269._20_4_ = fVar215 * auVar235._20_4_;
    fVar267 = auVar164._24_4_;
    auVar269._24_4_ = fVar267 * auVar235._24_4_;
    auVar269._28_4_ = local_840._28_4_;
    auVar96 = vfmsub231ps_fma(auVar269,local_940,auVar11);
    auVar194 = vsubps_avx(auVar14,auVar100);
    fVar270 = auVar11._0_4_;
    fVar271 = auVar11._4_4_;
    auVar291._4_4_ = fVar271 * local_a40._4_4_;
    auVar291._0_4_ = fVar270 * local_a40._0_4_;
    fVar272 = auVar11._8_4_;
    auVar291._8_4_ = fVar272 * local_a40._8_4_;
    fVar277 = auVar11._12_4_;
    auVar291._12_4_ = fVar277 * local_a40._12_4_;
    fVar278 = auVar11._16_4_;
    auVar291._16_4_ = fVar278 * local_a40._16_4_;
    fVar279 = auVar11._20_4_;
    auVar291._20_4_ = fVar279 * local_a40._20_4_;
    fVar280 = auVar11._24_4_;
    auVar291._24_4_ = fVar280 * local_a40._24_4_;
    auVar291._28_4_ = auVar13._28_4_;
    auVar202 = vfmsub231ps_fma(auVar291,auVar235,auVar194);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar202._12_4_ * auVar202._12_4_,
                                                 CONCAT48(auVar202._8_4_ * auVar202._8_4_,
                                                          CONCAT44(auVar202._4_4_ * auVar202._4_4_,
                                                                   auVar202._0_4_ * auVar202._0_4_))
                                                )),ZEXT1632(auVar96),ZEXT1632(auVar96));
    fVar198 = auVar194._0_4_;
    fVar210 = auVar194._4_4_;
    auVar4._4_4_ = fVar210 * local_940._4_4_;
    auVar4._0_4_ = fVar198 * local_940._0_4_;
    fVar211 = auVar194._8_4_;
    auVar4._8_4_ = fVar211 * local_940._8_4_;
    fVar212 = auVar194._12_4_;
    auVar4._12_4_ = fVar212 * local_940._12_4_;
    fVar213 = auVar194._16_4_;
    auVar4._16_4_ = fVar213 * local_940._16_4_;
    fVar240 = auVar194._20_4_;
    auVar4._20_4_ = fVar240 * local_940._20_4_;
    fVar248 = auVar194._24_4_;
    auVar4._24_4_ = fVar248 * local_940._24_4_;
    auVar4._28_4_ = auVar14._28_4_;
    auVar5 = vfmsub231ps_fma(auVar4,local_a40,auVar164);
    auVar191._0_4_ = fVar171 * fVar171;
    auVar191._4_4_ = fVar172 * fVar172;
    auVar191._8_4_ = fVar173 * fVar173;
    auVar191._12_4_ = fVar174 * fVar174;
    auVar191._16_4_ = fVar214 * fVar214;
    auVar191._20_4_ = fVar215 * fVar215;
    auVar191._24_4_ = fVar267 * fVar267;
    auVar191._28_4_ = 0;
    auVar202 = vfmadd231ps_fma(auVar191,auVar194,auVar194);
    auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar11,auVar11);
    auVar110 = vrcpps_avx(ZEXT1632(auVar202));
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar5),ZEXT1632(auVar5));
    auVar265._8_4_ = 0x3f800000;
    auVar265._0_8_ = &DAT_3f8000003f800000;
    auVar265._12_4_ = 0x3f800000;
    auVar265._16_4_ = 0x3f800000;
    auVar265._20_4_ = 0x3f800000;
    auVar265._24_4_ = 0x3f800000;
    auVar265._28_4_ = 0x3f800000;
    auVar96 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar202),auVar265);
    auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar110,auVar110);
    local_660 = vpermps_avx2(_DAT_0205d4a0,auVar235);
    local_aa0 = vpermps_avx2(_DAT_0205d4a0,local_940);
    auVar8._4_4_ = fVar172 * local_660._4_4_;
    auVar8._0_4_ = fVar171 * local_660._0_4_;
    auVar8._8_4_ = fVar173 * local_660._8_4_;
    auVar8._12_4_ = fVar174 * local_660._12_4_;
    auVar8._16_4_ = fVar214 * local_660._16_4_;
    auVar8._20_4_ = fVar215 * local_660._20_4_;
    auVar8._24_4_ = fVar267 * local_660._24_4_;
    auVar8._28_4_ = auVar110._28_4_;
    auVar6 = vfmsub231ps_fma(auVar8,local_aa0,auVar11);
    local_920 = vpermps_avx2(_DAT_0205d4a0,local_a40);
    auVar9._4_4_ = fVar271 * local_920._4_4_;
    auVar9._0_4_ = fVar270 * local_920._0_4_;
    auVar9._8_4_ = fVar272 * local_920._8_4_;
    auVar9._12_4_ = fVar277 * local_920._12_4_;
    auVar9._16_4_ = fVar278 * local_920._16_4_;
    auVar9._20_4_ = fVar279 * local_920._20_4_;
    auVar9._24_4_ = fVar280 * local_920._24_4_;
    auVar9._28_4_ = 0;
    auVar127 = vfmsub231ps_fma(auVar9,local_660,auVar194);
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar127._12_4_ * auVar127._12_4_,
                                                CONCAT48(auVar127._8_4_ * auVar127._8_4_,
                                                         CONCAT44(auVar127._4_4_ * auVar127._4_4_,
                                                                  auVar127._0_4_ * auVar127._0_4_)))
                                     ),ZEXT1632(auVar6),ZEXT1632(auVar6));
    fVar85 = local_aa0._0_4_;
    auVar225._0_4_ = fVar198 * fVar85;
    fVar86 = local_aa0._4_4_;
    auVar225._4_4_ = fVar210 * fVar86;
    fVar261 = local_aa0._8_4_;
    auVar225._8_4_ = fVar211 * fVar261;
    fVar262 = local_aa0._12_4_;
    auVar225._12_4_ = fVar212 * fVar262;
    fVar293 = local_aa0._16_4_;
    auVar225._16_4_ = fVar213 * fVar293;
    fVar294 = local_aa0._20_4_;
    auVar225._20_4_ = fVar240 * fVar294;
    fVar295 = local_aa0._24_4_;
    auVar225._24_4_ = fVar248 * fVar295;
    auVar225._28_4_ = 0;
    auVar127 = vfmsub231ps_fma(auVar225,local_920,auVar164);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar127),ZEXT1632(auVar127));
    auVar110 = vmaxps_avx(ZEXT1632(CONCAT412(auVar5._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar5._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar5._4_4_ * auVar96._4_4_,
                                                               auVar5._0_4_ * auVar96._0_4_)))),
                          ZEXT1632(CONCAT412(auVar6._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar6._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar6._4_4_ * auVar96._4_4_,
                                                               auVar6._0_4_ * auVar96._0_4_)))));
    local_6c0._0_4_ = auVar89._0_4_ + fVar117;
    local_6c0._4_4_ = auVar89._4_4_ + fVar151;
    local_6c0._8_4_ = auVar89._8_4_ + fVar152;
    local_6c0._12_4_ = auVar89._12_4_ + fVar153;
    local_6c0._16_4_ = fVar154 + 0.0;
    local_6c0._20_4_ = fVar155 + 0.0;
    local_6c0._24_4_ = fVar156 + 0.0;
    local_6c0._28_4_ = auVar10._28_4_ + 0.0;
    local_6a0 = ZEXT1632(auVar89);
    auVar10 = vsubps_avx(local_6a0,auVar103);
    local_6e0 = vpermps_avx2(_DAT_0205d4a0,auVar10);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,local_6a0);
    auStack_6f0 = auVar15._16_16_;
    auVar10 = vmaxps_avx(local_6a0,local_6c0);
    auVar102 = vmaxps_avx(local_6e0,auVar15);
    auVar140 = vrsqrtps_avx(ZEXT1632(auVar202));
    auVar10 = vmaxps_avx(auVar10,auVar102);
    fVar117 = auVar140._0_4_;
    fVar151 = auVar140._4_4_;
    fVar156 = auVar140._8_4_;
    fVar152 = auVar140._12_4_;
    fVar153 = auVar140._16_4_;
    fVar154 = auVar140._20_4_;
    fVar155 = auVar140._24_4_;
    auVar17._4_4_ = fVar151 * fVar151 * fVar151 * auVar202._4_4_ * -0.5;
    auVar17._0_4_ = fVar117 * fVar117 * fVar117 * auVar202._0_4_ * -0.5;
    auVar17._8_4_ = fVar156 * fVar156 * fVar156 * auVar202._8_4_ * -0.5;
    auVar17._12_4_ = fVar152 * fVar152 * fVar152 * auVar202._12_4_ * -0.5;
    auVar17._16_4_ = fVar153 * fVar153 * fVar153 * -0.0;
    auVar17._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar17._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar17._28_4_ = local_660._28_4_;
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_fma(auVar17,auVar101,auVar140);
    auVar266 = ZEXT1664(auVar96);
    fVar151 = auVar96._0_4_;
    fVar156 = auVar96._4_4_;
    auVar18._4_4_ = fVar210 * fVar156;
    auVar18._0_4_ = fVar198 * fVar151;
    fVar153 = auVar96._8_4_;
    auVar18._8_4_ = fVar211 * fVar153;
    fVar155 = auVar96._12_4_;
    auVar18._12_4_ = fVar212 * fVar155;
    auVar18._16_4_ = fVar213 * 0.0;
    auVar18._20_4_ = fVar240 * 0.0;
    auVar18._24_4_ = fVar248 * 0.0;
    auVar18._28_4_ = 0;
    fVar240 = local_980._0_4_;
    fVar248 = local_980._4_4_;
    auVar19._4_4_ = fVar248 * fVar172 * fVar156;
    auVar19._0_4_ = fVar240 * fVar171 * fVar151;
    fVar249 = local_980._8_4_;
    auVar19._8_4_ = fVar249 * fVar173 * fVar153;
    fVar250 = local_980._12_4_;
    auVar19._12_4_ = fVar250 * fVar174 * fVar155;
    fVar251 = local_980._16_4_;
    auVar19._16_4_ = fVar251 * fVar214 * 0.0;
    fVar252 = local_980._20_4_;
    auVar19._20_4_ = fVar252 * fVar215 * 0.0;
    fVar253 = local_980._24_4_;
    auVar19._24_4_ = fVar253 * fVar267 * 0.0;
    auVar19._28_4_ = auVar164._28_4_;
    auVar96 = vfmadd231ps_fma(auVar19,auVar18,_local_960);
    auVar291 = ZEXT1632(auVar119);
    auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar166 = vsubps_avx(auVar102,auVar291);
    fVar198 = auVar166._0_4_;
    fVar210 = auVar166._4_4_;
    auVar20._4_4_ = fVar210 * fVar172 * fVar156;
    auVar20._0_4_ = fVar198 * fVar171 * fVar151;
    fVar211 = auVar166._8_4_;
    auVar20._8_4_ = fVar211 * fVar173 * fVar153;
    fVar212 = auVar166._12_4_;
    auVar20._12_4_ = fVar212 * fVar174 * fVar155;
    fVar213 = auVar166._16_4_;
    auVar20._16_4_ = fVar213 * fVar214 * 0.0;
    fVar214 = auVar166._20_4_;
    auVar20._20_4_ = fVar214 * fVar215 * 0.0;
    fVar215 = auVar166._24_4_;
    auVar20._24_4_ = fVar215 * fVar267 * 0.0;
    auVar20._28_4_ = auVar194._28_4_;
    auVar12 = vsubps_avx(auVar102,auVar100);
    auVar202 = vfmadd231ps_fma(auVar20,auVar12,auVar18);
    auVar21._4_4_ = fVar271 * fVar156;
    auVar21._0_4_ = fVar270 * fVar151;
    auVar21._8_4_ = fVar272 * fVar153;
    auVar21._12_4_ = fVar277 * fVar155;
    auVar21._16_4_ = fVar278 * 0.0;
    auVar21._20_4_ = fVar279 * 0.0;
    auVar21._24_4_ = fVar280 * 0.0;
    auVar21._28_4_ = auVar140._28_4_;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar21,_local_ac0);
    auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar228 = vsubps_avx(auVar103,auVar190);
    auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar228,auVar21);
    auVar22._4_4_ = fVar248 * fVar210;
    auVar22._0_4_ = fVar240 * fVar198;
    auVar22._8_4_ = fVar249 * fVar211;
    auVar22._12_4_ = fVar250 * fVar212;
    auVar22._16_4_ = fVar251 * fVar213;
    auVar22._20_4_ = fVar252 * fVar214;
    auVar22._24_4_ = fVar253 * fVar215;
    auVar22._28_4_ = auVar140._28_4_;
    auVar5 = vfmadd231ps_fma(auVar22,_local_960,auVar12);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_ac0,auVar228);
    fVar117 = auVar202._0_4_;
    fVar267 = auVar96._0_4_;
    fVar152 = auVar202._4_4_;
    fVar270 = auVar96._4_4_;
    fVar154 = auVar202._8_4_;
    fVar271 = auVar96._8_4_;
    fVar171 = auVar202._12_4_;
    fVar272 = auVar96._12_4_;
    auVar23._28_4_ = local_ac0._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar272 * fVar171,
                            CONCAT48(fVar271 * fVar154,CONCAT44(fVar270 * fVar152,fVar267 * fVar117)
                                    )));
    auVar140 = vsubps_avx(ZEXT1632(auVar5),auVar23);
    auVar24._4_4_ = fVar210 * fVar210;
    auVar24._0_4_ = fVar198 * fVar198;
    auVar24._8_4_ = fVar211 * fVar211;
    auVar24._12_4_ = fVar212 * fVar212;
    auVar24._16_4_ = fVar213 * fVar213;
    auVar24._20_4_ = fVar214 * fVar214;
    auVar24._24_4_ = fVar215 * fVar215;
    auVar24._28_4_ = local_ac0._28_4_;
    auVar5 = vfmadd231ps_fma(auVar24,auVar12,auVar12);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar228,auVar228);
    auVar25._28_4_ = auVar11._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar171 * fVar171,
                            CONCAT48(fVar154 * fVar154,CONCAT44(fVar152 * fVar152,fVar117 * fVar117)
                                    )));
    local_720 = vsubps_avx(ZEXT1632(auVar5),auVar25);
    auVar102 = vsqrtps_avx(auVar110);
    fVar117 = (auVar10._0_4_ + auVar102._0_4_) * 1.0000002;
    fVar152 = (auVar10._4_4_ + auVar102._4_4_) * 1.0000002;
    fVar154 = (auVar10._8_4_ + auVar102._8_4_) * 1.0000002;
    fVar171 = (auVar10._12_4_ + auVar102._12_4_) * 1.0000002;
    fVar172 = (auVar10._16_4_ + auVar102._16_4_) * 1.0000002;
    fVar173 = (auVar10._20_4_ + auVar102._20_4_) * 1.0000002;
    fVar174 = (auVar10._24_4_ + auVar102._24_4_) * 1.0000002;
    auVar26._4_4_ = fVar152 * fVar152;
    auVar26._0_4_ = fVar117 * fVar117;
    auVar26._8_4_ = fVar154 * fVar154;
    auVar26._12_4_ = fVar171 * fVar171;
    auVar26._16_4_ = fVar172 * fVar172;
    auVar26._20_4_ = fVar173 * fVar173;
    auVar26._24_4_ = fVar174 * fVar174;
    auVar26._28_4_ = auVar10._28_4_ + auVar102._28_4_;
    auVar258._0_4_ = auVar140._0_4_ + auVar140._0_4_;
    auVar258._4_4_ = auVar140._4_4_ + auVar140._4_4_;
    auVar258._8_4_ = auVar140._8_4_ + auVar140._8_4_;
    auVar258._12_4_ = auVar140._12_4_ + auVar140._12_4_;
    auVar258._16_4_ = auVar140._16_4_ + auVar140._16_4_;
    auVar258._20_4_ = auVar140._20_4_ + auVar140._20_4_;
    auVar258._24_4_ = auVar140._24_4_ + auVar140._24_4_;
    fVar117 = auVar140._28_4_;
    auVar258._28_4_ = fVar117 + fVar117;
    auVar140 = vsubps_avx(local_720,auVar26);
    auVar269 = ZEXT1632(auVar96);
    auVar27._28_4_ = auVar10._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar272 * fVar272,
                            CONCAT48(fVar271 * fVar271,CONCAT44(fVar270 * fVar270,fVar267 * fVar267)
                                    )));
    auVar10 = vsubps_avx(local_220,auVar27);
    auVar28._4_4_ = auVar258._4_4_ * auVar258._4_4_;
    auVar28._0_4_ = auVar258._0_4_ * auVar258._0_4_;
    auVar28._8_4_ = auVar258._8_4_ * auVar258._8_4_;
    auVar28._12_4_ = auVar258._12_4_ * auVar258._12_4_;
    auVar28._16_4_ = auVar258._16_4_ * auVar258._16_4_;
    auVar28._20_4_ = auVar258._20_4_ * auVar258._20_4_;
    auVar28._24_4_ = auVar258._24_4_ * auVar258._24_4_;
    auVar28._28_4_ = fVar117;
    fVar152 = auVar10._0_4_;
    fVar154 = auVar10._4_4_;
    fVar171 = auVar10._8_4_;
    fVar172 = auVar10._12_4_;
    fVar173 = auVar10._16_4_;
    fVar174 = auVar10._20_4_;
    fVar267 = auVar10._24_4_;
    auVar29._4_4_ = auVar140._4_4_ * fVar154 * 4.0;
    auVar29._0_4_ = auVar140._0_4_ * fVar152 * 4.0;
    auVar29._8_4_ = auVar140._8_4_ * fVar171 * 4.0;
    auVar29._12_4_ = auVar140._12_4_ * fVar172 * 4.0;
    auVar29._16_4_ = auVar140._16_4_ * fVar173 * 4.0;
    auVar29._20_4_ = auVar140._20_4_ * fVar174 * 4.0;
    auVar29._24_4_ = auVar140._24_4_ * fVar267 * 4.0;
    auVar29._28_4_ = 0x40800000;
    auVar193 = vsubps_avx(auVar28,auVar29);
    auVar110 = vcmpps_avx(auVar193,auVar103,5);
    auVar103 = ZEXT1632(auVar202);
    fVar117 = auVar10._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar259._8_4_ = 0x7f800000;
      auVar259._0_8_ = 0x7f8000007f800000;
      auVar259._12_4_ = 0x7f800000;
      auVar259._16_4_ = 0x7f800000;
      auVar259._20_4_ = 0x7f800000;
      auVar259._24_4_ = 0x7f800000;
      auVar259._28_4_ = 0x7f800000;
      auVar226._8_4_ = 0xff800000;
      auVar226._0_8_ = 0xff800000ff800000;
      auVar226._12_4_ = 0xff800000;
      auVar226._16_4_ = 0xff800000;
      auVar226._20_4_ = 0xff800000;
      auVar226._24_4_ = 0xff800000;
      auVar226._28_4_ = 0xff800000;
      auVar4 = local_720;
    }
    else {
      auVar9 = vsqrtps_avx(auVar193);
      auVar243._0_4_ = fVar152 + fVar152;
      auVar243._4_4_ = fVar154 + fVar154;
      auVar243._8_4_ = fVar171 + fVar171;
      auVar243._12_4_ = fVar172 + fVar172;
      auVar243._16_4_ = fVar173 + fVar173;
      auVar243._20_4_ = fVar174 + fVar174;
      auVar243._24_4_ = fVar267 + fVar267;
      auVar243._28_4_ = fVar117 + fVar117;
      auVar8 = vrcpps_avx(auVar243);
      auVar4 = vcmpps_avx(auVar193,ZEXT832(0) << 0x20,5);
      auVar227._8_4_ = 0x3f800000;
      auVar227._0_8_ = &DAT_3f8000003f800000;
      auVar227._12_4_ = 0x3f800000;
      auVar227._16_4_ = 0x3f800000;
      auVar227._20_4_ = 0x3f800000;
      auVar227._24_4_ = 0x3f800000;
      auVar227._28_4_ = 0x3f800000;
      auVar96 = vfnmadd213ps_fma(auVar243,auVar8,auVar227);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar8,auVar8);
      uVar83 = CONCAT44(auVar258._4_4_,auVar258._0_4_);
      auVar104._0_8_ = uVar83 ^ 0x8000000080000000;
      auVar104._8_4_ = -auVar258._8_4_;
      auVar104._12_4_ = -auVar258._12_4_;
      auVar104._16_4_ = -auVar258._16_4_;
      auVar104._20_4_ = -auVar258._20_4_;
      auVar104._24_4_ = -auVar258._24_4_;
      auVar104._28_4_ = -auVar258._28_4_;
      auVar193 = vsubps_avx(auVar104,auVar9);
      auVar30._4_4_ = auVar193._4_4_ * auVar96._4_4_;
      auVar30._0_4_ = auVar193._0_4_ * auVar96._0_4_;
      auVar30._8_4_ = auVar193._8_4_ * auVar96._8_4_;
      auVar30._12_4_ = auVar193._12_4_ * auVar96._12_4_;
      auVar30._16_4_ = auVar193._16_4_ * 0.0;
      auVar30._20_4_ = auVar193._20_4_ * 0.0;
      auVar30._24_4_ = auVar193._24_4_ * 0.0;
      auVar30._28_4_ = auVar193._28_4_;
      auVar193 = vsubps_avx(auVar9,auVar258);
      auVar31._4_4_ = auVar193._4_4_ * auVar96._4_4_;
      auVar31._0_4_ = auVar193._0_4_ * auVar96._0_4_;
      auVar31._8_4_ = auVar193._8_4_ * auVar96._8_4_;
      auVar31._12_4_ = auVar193._12_4_ * auVar96._12_4_;
      auVar31._16_4_ = auVar193._16_4_ * 0.0;
      auVar31._20_4_ = auVar193._20_4_ * 0.0;
      auVar31._24_4_ = auVar193._24_4_ * 0.0;
      auVar31._28_4_ = auVar193._28_4_;
      auVar96 = vfmadd213ps_fma(auVar269,auVar30,auVar103);
      local_440 = ZEXT1632(CONCAT412(fVar155 * auVar96._12_4_,
                                     CONCAT48(fVar153 * auVar96._8_4_,
                                              CONCAT44(fVar156 * auVar96._4_4_,
                                                       fVar151 * auVar96._0_4_))));
      auVar96 = vfmadd213ps_fma(auVar269,auVar31,auVar103);
      local_460 = ZEXT1632(CONCAT412(fVar155 * auVar96._12_4_,
                                     CONCAT48(fVar153 * auVar96._8_4_,
                                              CONCAT44(fVar156 * auVar96._4_4_,
                                                       fVar151 * auVar96._0_4_))));
      auVar236._8_4_ = 0x7f800000;
      auVar236._0_8_ = 0x7f8000007f800000;
      auVar236._12_4_ = 0x7f800000;
      auVar236._16_4_ = 0x7f800000;
      auVar236._20_4_ = 0x7f800000;
      auVar236._24_4_ = 0x7f800000;
      auVar236._28_4_ = 0x7f800000;
      auVar259 = vblendvps_avx(auVar236,auVar30,auVar4);
      auVar65._4_4_ = uStack_77c;
      auVar65._0_4_ = local_780;
      auVar65._8_4_ = uStack_778;
      auVar65._12_4_ = uStack_774;
      auVar65._16_4_ = uStack_770;
      auVar65._20_4_ = uStack_76c;
      auVar65._24_4_ = uStack_768;
      auVar65._28_4_ = uStack_764;
      auVar193 = vandps_avx(auVar27,auVar65);
      auVar193 = vmaxps_avx(local_400,auVar193);
      auVar32._4_4_ = auVar193._4_4_ * 1.9073486e-06;
      auVar32._0_4_ = auVar193._0_4_ * 1.9073486e-06;
      auVar32._8_4_ = auVar193._8_4_ * 1.9073486e-06;
      auVar32._12_4_ = auVar193._12_4_ * 1.9073486e-06;
      auVar32._16_4_ = auVar193._16_4_ * 1.9073486e-06;
      auVar32._20_4_ = auVar193._20_4_ * 1.9073486e-06;
      auVar32._24_4_ = auVar193._24_4_ * 1.9073486e-06;
      auVar32._28_4_ = auVar193._28_4_;
      auVar193 = vandps_avx(auVar10,auVar65);
      auVar193 = vcmpps_avx(auVar193,auVar32,1);
      auVar105._8_4_ = 0xff800000;
      auVar105._0_8_ = 0xff800000ff800000;
      auVar105._12_4_ = 0xff800000;
      auVar105._16_4_ = 0xff800000;
      auVar105._20_4_ = 0xff800000;
      auVar105._24_4_ = 0xff800000;
      auVar105._28_4_ = 0xff800000;
      auVar226 = vblendvps_avx(auVar105,auVar31,auVar4);
      auVar8 = auVar4 & auVar193;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar110 = vandps_avx(auVar4,auVar193);
        auVar193 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
        auVar292._8_4_ = 0x7f800000;
        auVar292._0_8_ = 0x7f8000007f800000;
        auVar292._12_4_ = 0x7f800000;
        auVar292._16_4_ = 0x7f800000;
        auVar292._20_4_ = 0x7f800000;
        auVar292._24_4_ = 0x7f800000;
        auVar292._28_4_ = 0x7f800000;
        auVar246._8_4_ = 0xff800000;
        auVar246._0_8_ = 0xff800000ff800000;
        auVar246._12_4_ = 0xff800000;
        auVar246._16_4_ = 0xff800000;
        auVar246._20_4_ = 0xff800000;
        auVar246._24_4_ = 0xff800000;
        auVar246._28_4_ = 0xff800000;
        auVar140 = vblendvps_avx(auVar292,auVar246,auVar193);
        auVar96 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar8 = vpmovsxwd_avx2(auVar96);
        auVar259 = vblendvps_avx(auVar259,auVar140,auVar8);
        auVar247._8_4_ = 0xff800000;
        auVar247._0_8_ = 0xff800000ff800000;
        auVar247._12_4_ = 0xff800000;
        auVar247._16_4_ = 0xff800000;
        auVar247._20_4_ = 0xff800000;
        auVar247._24_4_ = 0xff800000;
        auVar247._28_4_ = 0xff800000;
        auVar140 = vblendvps_avx(auVar247,auVar292,auVar193);
        auVar226 = vblendvps_avx(auVar226,auVar140,auVar8);
        auVar115._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
        auVar115._8_4_ = auVar110._8_4_ ^ 0xffffffff;
        auVar115._12_4_ = auVar110._12_4_ ^ 0xffffffff;
        auVar115._16_4_ = auVar110._16_4_ ^ 0xffffffff;
        auVar115._20_4_ = auVar110._20_4_ ^ 0xffffffff;
        auVar115._24_4_ = auVar110._24_4_ ^ 0xffffffff;
        auVar115._28_4_ = auVar110._28_4_ ^ 0xffffffff;
        auVar110 = vorps_avx(auVar193,auVar115);
        auVar110 = vandps_avx(auVar4,auVar110);
      }
    }
    auVar276 = ZEXT3264(auVar4);
    auVar239 = ZEXT3264(local_ae0);
    auVar140 = local_260 & auVar110;
    if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar140 >> 0x7f,0) == '\0') &&
          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar140 >> 0xbf,0) == '\0') &&
        (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar140[0x1f])
    {
      auVar233 = ZEXT3264(local_880);
      auVar285 = ZEXT3264(local_a00);
      auVar282 = ZEXT3264(local_a20);
    }
    else {
      fVar270 = *(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_;
      auVar106._4_4_ = fVar270;
      auVar106._0_4_ = fVar270;
      auVar106._8_4_ = fVar270;
      auVar106._12_4_ = fVar270;
      auVar106._16_4_ = fVar270;
      auVar106._20_4_ = fVar270;
      auVar106._24_4_ = fVar270;
      auVar106._28_4_ = fVar270;
      auVar193 = vminps_avx(auVar106,auVar226);
      auVar33._4_4_ = fVar210 * local_940._4_4_;
      auVar33._0_4_ = fVar198 * local_940._0_4_;
      auVar33._8_4_ = fVar211 * local_940._8_4_;
      auVar33._12_4_ = fVar212 * local_940._12_4_;
      auVar33._16_4_ = fVar213 * local_940._16_4_;
      auVar33._20_4_ = fVar214 * local_940._20_4_;
      auVar33._24_4_ = fVar215 * local_940._24_4_;
      auVar33._28_4_ = auVar166._28_4_;
      auVar96 = vfmadd213ps_fma(auVar12,local_a40,auVar33);
      auVar202 = vfmadd213ps_fma(auVar228,auVar235,ZEXT1632(auVar96));
      auVar34._4_4_ = fVar248 * local_940._4_4_;
      auVar34._0_4_ = fVar240 * local_940._0_4_;
      auVar34._8_4_ = fVar249 * local_940._8_4_;
      auVar34._12_4_ = fVar250 * local_940._12_4_;
      auVar34._16_4_ = fVar251 * local_940._16_4_;
      auVar34._20_4_ = fVar252 * local_940._20_4_;
      auVar34._24_4_ = fVar253 * local_940._24_4_;
      auVar34._28_4_ = 0;
      auVar96 = vfmadd231ps_fma(auVar34,local_a40,_local_960);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar235,_local_ac0);
      auVar66._4_4_ = uStack_77c;
      auVar66._0_4_ = local_780;
      auVar66._8_4_ = uStack_778;
      auVar66._12_4_ = uStack_774;
      auVar66._16_4_ = uStack_770;
      auVar66._20_4_ = uStack_76c;
      auVar66._24_4_ = uStack_768;
      auVar66._28_4_ = uStack_764;
      auVar140 = vandps_avx(auVar66,ZEXT1632(auVar5));
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar207._16_4_ = 0x219392ef;
      auVar207._20_4_ = 0x219392ef;
      auVar207._24_4_ = 0x219392ef;
      auVar207._28_4_ = 0x219392ef;
      auVar166 = vcmpps_avx(auVar140,auVar207,1);
      auVar140 = vrcpps_avx(ZEXT1632(auVar5));
      auVar289._8_4_ = 0x3f800000;
      auVar289._0_8_ = &DAT_3f8000003f800000;
      auVar289._12_4_ = 0x3f800000;
      auVar289._16_4_ = 0x3f800000;
      auVar289._20_4_ = 0x3f800000;
      auVar289._24_4_ = 0x3f800000;
      auVar289._28_4_ = 0x3f800000;
      auVar228 = ZEXT1632(auVar5);
      auVar96 = vfnmadd213ps_fma(auVar140,auVar228,auVar289);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar140,auVar140);
      auVar192._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
      auVar192._8_4_ = auVar5._8_4_ ^ 0x80000000;
      auVar192._12_4_ = auVar5._12_4_ ^ 0x80000000;
      auVar192._16_4_ = 0x80000000;
      auVar192._20_4_ = 0x80000000;
      auVar192._24_4_ = 0x80000000;
      auVar192._28_4_ = 0x80000000;
      auVar244._0_4_ = auVar96._0_4_ * -auVar202._0_4_;
      auVar244._4_4_ = auVar96._4_4_ * -auVar202._4_4_;
      auVar244._8_4_ = auVar96._8_4_ * -auVar202._8_4_;
      auVar244._12_4_ = auVar96._12_4_ * -auVar202._12_4_;
      auVar244._16_4_ = 0x80000000;
      auVar244._20_4_ = 0x80000000;
      auVar244._24_4_ = 0x80000000;
      auVar244._28_4_ = 0;
      auVar140 = vcmpps_avx(auVar228,auVar192,1);
      auVar140 = vorps_avx(auVar166,auVar140);
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar140 = vblendvps_avx(auVar244,auVar275,auVar140);
      auVar71._4_4_ = fStack_2fc;
      auVar71._0_4_ = local_300;
      auVar71._8_4_ = fStack_2f8;
      auVar71._12_4_ = fStack_2f4;
      auVar71._16_4_ = fStack_2f0;
      auVar71._20_4_ = fStack_2ec;
      auVar71._24_4_ = fStack_2e8;
      auVar71._28_4_ = fStack_2e4;
      auVar12 = vmaxps_avx(auVar71,auVar259);
      auVar12 = vmaxps_avx(auVar12,auVar140);
      auVar140 = vcmpps_avx(auVar228,auVar192,6);
      auVar140 = vorps_avx(auVar166,auVar140);
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar140 = vblendvps_avx(auVar244,auVar229,auVar140);
      _local_900 = vminps_avx(auVar193,auVar140);
      auVar140 = vsubps_avx(ZEXT832(0) << 0x20,auVar14);
      auVar166 = vsubps_avx(ZEXT832(0) << 0x20,local_840._0_32_);
      auVar35._4_4_ = auVar166._4_4_ * fVar86;
      auVar35._0_4_ = auVar166._0_4_ * fVar85;
      auVar35._8_4_ = auVar166._8_4_ * fVar261;
      auVar35._12_4_ = auVar166._12_4_ * fVar262;
      auVar35._16_4_ = auVar166._16_4_ * fVar293;
      auVar35._20_4_ = auVar166._20_4_ * fVar294;
      auVar35._24_4_ = auVar166._24_4_ * fVar295;
      auVar35._28_4_ = auVar166._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar35,local_920,auVar140);
      auVar140 = vsubps_avx(ZEXT832(0) << 0x20,auVar13);
      auVar202 = vfnmadd231ps_fma(ZEXT1632(auVar96),local_660,auVar140);
      auVar36._4_4_ = fVar248 * fVar86;
      auVar36._0_4_ = fVar240 * fVar85;
      auVar36._8_4_ = fVar249 * fVar261;
      auVar36._12_4_ = fVar250 * fVar262;
      auVar36._16_4_ = fVar251 * fVar293;
      auVar36._20_4_ = fVar252 * fVar294;
      auVar36._24_4_ = fVar253 * fVar295;
      auVar36._28_4_ = auVar140._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar36,local_920,_local_960);
      auVar5 = vfnmadd231ps_fma(ZEXT1632(auVar96),local_660,_local_ac0);
      auVar140 = vandps_avx(auVar66,ZEXT1632(auVar5));
      auVar228 = vrcpps_avx(ZEXT1632(auVar5));
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar166 = vcmpps_avx(auVar140,auVar107,1);
      auVar193 = ZEXT1632(auVar5);
      auVar96 = vfnmadd213ps_fma(auVar228,auVar193,auVar289);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar228,auVar228);
      auVar245._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
      auVar245._8_4_ = auVar5._8_4_ ^ 0x80000000;
      auVar245._12_4_ = auVar5._12_4_ ^ 0x80000000;
      auVar245._16_4_ = 0x80000000;
      auVar245._20_4_ = 0x80000000;
      auVar245._24_4_ = 0x80000000;
      auVar245._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar96._4_4_ * -auVar202._4_4_;
      auVar37._0_4_ = auVar96._0_4_ * -auVar202._0_4_;
      auVar37._8_4_ = auVar96._8_4_ * -auVar202._8_4_;
      auVar37._12_4_ = auVar96._12_4_ * -auVar202._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar140 = vcmpps_avx(auVar193,auVar245,1);
      auVar140 = vorps_avx(auVar140,auVar166);
      auVar108._8_4_ = 0xff800000;
      auVar108._0_8_ = 0xff800000ff800000;
      auVar108._12_4_ = 0xff800000;
      auVar108._16_4_ = 0xff800000;
      auVar108._20_4_ = 0xff800000;
      auVar108._24_4_ = 0xff800000;
      auVar108._28_4_ = 0xff800000;
      auVar140 = vblendvps_avx(auVar37,auVar108,auVar140);
      auVar276 = ZEXT3264(auVar140);
      _local_760 = vmaxps_avx(auVar12,auVar140);
      auVar140 = vcmpps_avx(auVar193,auVar245,6);
      auVar140 = vorps_avx(auVar166,auVar140);
      auVar109._8_4_ = 0x7f800000;
      auVar109._0_8_ = 0x7f8000007f800000;
      auVar109._12_4_ = 0x7f800000;
      auVar109._16_4_ = 0x7f800000;
      auVar109._20_4_ = 0x7f800000;
      auVar109._24_4_ = 0x7f800000;
      auVar109._28_4_ = 0x7f800000;
      auVar140 = vblendvps_avx(auVar37,auVar109,auVar140);
      auVar110 = vandps_avx(local_260,auVar110);
      local_340 = vminps_avx(_local_900,auVar140);
      auVar140 = vcmpps_avx(_local_760,local_340,2);
      auVar166 = auVar110 & auVar140;
      if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar166 >> 0x7f,0) == '\0') &&
            (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar166 >> 0xbf,0) == '\0') &&
          (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar166[0x1f]) {
        auVar233 = ZEXT3264(local_880);
        auVar285 = ZEXT3264(local_a00);
        auVar282 = ZEXT3264(local_a20);
        auVar239 = ZEXT3264(local_ae0);
      }
      else {
        local_8e0._8_4_ = 0x80000000;
        local_8e0._0_8_ = 0x8000000080000000;
        local_8e0._12_4_ = 0x80000000;
        uStack_8d0 = 0x80000000;
        uStack_8cc = 0x80000000;
        uStack_8c8 = 0x80000000;
        uStack_8c4 = 0x80000000;
        auVar166 = vminps_avx(local_440,auVar289);
        auVar206 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar166 = vmaxps_avx(auVar166,ZEXT832(0) << 0x20);
        auVar12 = vminps_avx(local_460,auVar289);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        auVar38._4_4_ = (auVar166._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar166._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar166._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar166._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar166._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar166._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar166._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar166._28_4_ + 7.0;
        auVar96 = vfmadd213ps_fma(auVar38,local_9a0,local_680);
        auVar39._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar12._28_4_ + 7.0;
        auVar202 = vfmadd213ps_fma(auVar39,local_9a0,local_680);
        auVar166 = vminps_avx(local_6a0,local_6c0);
        auVar12 = vminps_avx(local_6e0,auVar15);
        auVar166 = vminps_avx(auVar166,auVar12);
        auVar102 = vsubps_avx(auVar166,auVar102);
        auVar110 = vandps_avx(auVar140,auVar110);
        local_440 = ZEXT1632(auVar96);
        local_460 = ZEXT1632(auVar202);
        auVar40._4_4_ = auVar102._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar102._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar102._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar102._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar102._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar102._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar102._24_4_ * 0.99999976;
        auVar40._28_4_ = 0x3f7ffffc;
        auVar102 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar41._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar41._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar41._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar41._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar41._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar41._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar41._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar41._28_4_ = auVar102._28_4_;
        auVar140 = vsubps_avx(local_720,auVar41);
        auVar276 = ZEXT3264(auVar140);
        auVar42._4_4_ = auVar140._4_4_ * fVar154 * 4.0;
        auVar42._0_4_ = auVar140._0_4_ * fVar152 * 4.0;
        auVar42._8_4_ = auVar140._8_4_ * fVar171 * 4.0;
        auVar42._12_4_ = auVar140._12_4_ * fVar172 * 4.0;
        auVar42._16_4_ = auVar140._16_4_ * fVar173 * 4.0;
        auVar42._20_4_ = auVar140._20_4_ * fVar174 * 4.0;
        auVar42._24_4_ = auVar140._24_4_ * fVar267 * 4.0;
        auVar42._28_4_ = auVar102._28_4_;
        auVar102 = vsubps_avx(auVar28,auVar42);
        local_b80 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,5);
        if ((((((((local_b80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_b80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_b80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_b80 >> 0x7f,0) == '\0') &&
              (local_b80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_b80 >> 0xbf,0) == '\0') &&
            (local_b80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_b80[0x1f]) {
          auVar53 = ZEXT812(0);
          auVar164 = ZEXT1232(auVar53) << 0x20;
          local_7c0 = ZEXT1232(auVar53) << 0x20;
          _local_7e0 = ZEXT1232(auVar53) << 0x20;
          auVar194 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          _local_7a0 = local_7c0;
        }
        else {
          auVar165._0_4_ = fVar152 + fVar152;
          auVar165._4_4_ = fVar154 + fVar154;
          auVar165._8_4_ = fVar171 + fVar171;
          auVar165._12_4_ = fVar172 + fVar172;
          auVar165._16_4_ = fVar173 + fVar173;
          auVar165._20_4_ = fVar174 + fVar174;
          auVar165._24_4_ = fVar267 + fVar267;
          auVar165._28_4_ = fVar117 + fVar117;
          auVar166 = vrcpps_avx(auVar165);
          auVar96 = vfnmadd213ps_fma(auVar165,auVar166,auVar289);
          auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar166,auVar166);
          auVar166 = vsqrtps_avx(auVar102);
          uVar83 = CONCAT44(auVar258._4_4_,auVar258._0_4_);
          auVar208._0_8_ = uVar83 ^ 0x8000000080000000;
          auVar208._8_4_ = -auVar258._8_4_;
          auVar208._12_4_ = -auVar258._12_4_;
          auVar208._16_4_ = -auVar258._16_4_;
          auVar208._20_4_ = -auVar258._20_4_;
          auVar208._24_4_ = -auVar258._24_4_;
          auVar208._28_4_ = -auVar258._28_4_;
          auVar12 = vsubps_avx(auVar208,auVar166);
          auVar166 = vsubps_avx(auVar166,auVar258);
          fVar171 = auVar12._0_4_ * auVar96._0_4_;
          fVar293 = auVar12._4_4_ * auVar96._4_4_;
          auVar43._4_4_ = fVar293;
          auVar43._0_4_ = fVar171;
          fVar294 = auVar12._8_4_ * auVar96._8_4_;
          auVar43._8_4_ = fVar294;
          fVar295 = auVar12._12_4_ * auVar96._12_4_;
          auVar43._12_4_ = fVar295;
          fVar172 = auVar12._16_4_ * 0.0;
          auVar43._16_4_ = fVar172;
          fVar173 = auVar12._20_4_ * 0.0;
          auVar43._20_4_ = fVar173;
          fVar174 = auVar12._24_4_ * 0.0;
          auVar43._24_4_ = fVar174;
          auVar43._28_4_ = fVar117;
          fVar117 = auVar166._0_4_ * auVar96._0_4_;
          fVar85 = auVar166._4_4_ * auVar96._4_4_;
          auVar44._4_4_ = fVar85;
          auVar44._0_4_ = fVar117;
          fVar86 = auVar166._8_4_ * auVar96._8_4_;
          auVar44._8_4_ = fVar86;
          fVar152 = auVar166._12_4_ * auVar96._12_4_;
          auVar44._12_4_ = fVar152;
          fVar261 = auVar166._16_4_ * 0.0;
          auVar44._16_4_ = fVar261;
          fVar154 = auVar166._20_4_ * 0.0;
          auVar44._20_4_ = fVar154;
          fVar262 = auVar166._24_4_ * 0.0;
          auVar44._24_4_ = fVar262;
          auVar44._28_4_ = 0x80000000;
          auVar96 = vfmadd213ps_fma(auVar269,auVar43,auVar103);
          auVar202 = vfmadd213ps_fma(auVar269,auVar44,auVar103);
          auVar45._28_4_ = auVar12._28_4_;
          auVar45._0_28_ =
               ZEXT1628(CONCAT412(fVar155 * auVar96._12_4_,
                                  CONCAT48(fVar153 * auVar96._8_4_,
                                           CONCAT44(fVar156 * auVar96._4_4_,fVar151 * auVar96._0_4_)
                                          )));
          auVar166 = ZEXT1632(CONCAT412(fVar155 * auVar202._12_4_,
                                        CONCAT48(fVar153 * auVar202._8_4_,
                                                 CONCAT44(fVar156 * auVar202._4_4_,
                                                          fVar151 * auVar202._0_4_))));
          auVar96 = vfmadd213ps_fma(auVar11,auVar45,auVar190);
          auVar202 = vfmadd213ps_fma(auVar11,auVar166,auVar190);
          auVar5 = vfmadd213ps_fma(auVar194,auVar45,auVar100);
          auVar6 = vfmadd213ps_fma(auVar194,auVar166,auVar100);
          auVar127 = vfmadd213ps_fma(auVar45,auVar164,auVar291);
          auVar7 = vfmadd213ps_fma(auVar164,auVar166,auVar291);
          auVar46._4_4_ = fVar293 * (float)local_ac0._4_4_;
          auVar46._0_4_ = fVar171 * (float)local_ac0._0_4_;
          auVar46._8_4_ = fVar294 * fStack_ab8;
          auVar46._12_4_ = fVar295 * fStack_ab4;
          auVar46._16_4_ = fVar172 * fStack_ab0;
          auVar46._20_4_ = fVar173 * fStack_aac;
          auVar46._24_4_ = fVar174 * fStack_aa8;
          auVar46._28_4_ = 0;
          auVar164 = vsubps_avx(auVar46,ZEXT1632(auVar96));
          auVar195._0_4_ = fVar171 * (float)local_960._0_4_;
          auVar195._4_4_ = fVar293 * (float)local_960._4_4_;
          auVar195._8_4_ = fVar294 * fStack_958;
          auVar195._12_4_ = fVar295 * fStack_954;
          auVar195._16_4_ = fVar172 * fStack_950;
          auVar195._20_4_ = fVar173 * fStack_94c;
          auVar195._24_4_ = fVar174 * fStack_948;
          auVar195._28_4_ = 0;
          auVar194 = vsubps_avx(auVar195,ZEXT1632(auVar5));
          auVar231._0_4_ = fVar240 * fVar171;
          auVar231._4_4_ = fVar248 * fVar293;
          auVar231._8_4_ = fVar249 * fVar294;
          auVar231._12_4_ = fVar250 * fVar295;
          auVar231._16_4_ = fVar251 * fVar172;
          auVar231._20_4_ = fVar252 * fVar173;
          auVar231._24_4_ = fVar253 * fVar174;
          auVar231._28_4_ = 0;
          auVar11 = vsubps_avx(auVar231,ZEXT1632(auVar127));
          auVar206 = auVar11._0_28_;
          auVar47._4_4_ = fVar85 * (float)local_ac0._4_4_;
          auVar47._0_4_ = fVar117 * (float)local_ac0._0_4_;
          auVar47._8_4_ = fVar86 * fStack_ab8;
          auVar47._12_4_ = fVar152 * fStack_ab4;
          auVar47._16_4_ = fVar261 * fStack_ab0;
          auVar47._20_4_ = fVar154 * fStack_aac;
          auVar47._24_4_ = fVar262 * fStack_aa8;
          auVar47._28_4_ = 0;
          _local_7a0 = vsubps_avx(auVar47,ZEXT1632(auVar202));
          auVar48._4_4_ = fVar85 * (float)local_960._4_4_;
          auVar48._0_4_ = fVar117 * (float)local_960._0_4_;
          auVar48._8_4_ = fVar86 * fStack_958;
          auVar48._12_4_ = fVar152 * fStack_954;
          auVar48._16_4_ = fVar261 * fStack_950;
          auVar48._20_4_ = fVar154 * fStack_94c;
          auVar48._24_4_ = fVar262 * fStack_948;
          auVar48._28_4_ = local_7a0._28_4_;
          local_7c0 = vsubps_avx(auVar48,ZEXT1632(auVar6));
          auVar49._4_4_ = fVar248 * fVar85;
          auVar49._0_4_ = fVar240 * fVar117;
          auVar49._8_4_ = fVar249 * fVar86;
          auVar49._12_4_ = fVar250 * fVar152;
          auVar49._16_4_ = fVar251 * fVar261;
          auVar49._20_4_ = fVar252 * fVar154;
          auVar49._24_4_ = fVar253 * fVar262;
          auVar49._28_4_ = local_7c0._28_4_;
          _local_7e0 = vsubps_avx(auVar49,ZEXT1632(auVar7));
          auVar11 = vcmpps_avx(auVar102,_DAT_02020f00,5);
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar230 = vblendvps_avx(auVar232,auVar43,auVar11);
          auVar67._4_4_ = uStack_77c;
          auVar67._0_4_ = local_780;
          auVar67._8_4_ = uStack_778;
          auVar67._12_4_ = uStack_774;
          auVar67._16_4_ = uStack_770;
          auVar67._20_4_ = uStack_76c;
          auVar67._24_4_ = uStack_768;
          auVar67._28_4_ = uStack_764;
          auVar102 = vandps_avx(auVar67,auVar27);
          auVar102 = vmaxps_avx(local_400,auVar102);
          auVar50._4_4_ = auVar102._4_4_ * 1.9073486e-06;
          auVar50._0_4_ = auVar102._0_4_ * 1.9073486e-06;
          auVar50._8_4_ = auVar102._8_4_ * 1.9073486e-06;
          auVar50._12_4_ = auVar102._12_4_ * 1.9073486e-06;
          auVar50._16_4_ = auVar102._16_4_ * 1.9073486e-06;
          auVar50._20_4_ = auVar102._20_4_ * 1.9073486e-06;
          auVar50._24_4_ = auVar102._24_4_ * 1.9073486e-06;
          auVar50._28_4_ = auVar102._28_4_;
          auVar10 = vandps_avx(auVar67,auVar10);
          auVar10 = vcmpps_avx(auVar10,auVar50,1);
          auVar266 = ZEXT3264(auVar10);
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
          auVar237 = vblendvps_avx(auVar238,auVar44,auVar11);
          auVar102 = auVar11 & auVar10;
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            auVar10 = vandps_avx(auVar10,auVar11);
            auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
            auVar281._8_4_ = 0xff800000;
            auVar281._0_8_ = 0xff800000ff800000;
            auVar281._12_4_ = 0xff800000;
            auVar281._16_4_ = 0xff800000;
            auVar281._20_4_ = 0xff800000;
            auVar281._24_4_ = 0xff800000;
            auVar281._28_4_ = 0xff800000;
            auVar284._8_4_ = 0x7f800000;
            auVar284._0_8_ = 0x7f8000007f800000;
            auVar284._12_4_ = 0x7f800000;
            auVar284._16_4_ = 0x7f800000;
            auVar284._20_4_ = 0x7f800000;
            auVar284._24_4_ = 0x7f800000;
            auVar284._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar284,auVar281,auVar140);
            auVar96 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
            auVar166 = vpmovsxwd_avx2(auVar96);
            auVar266 = ZEXT3264(auVar166);
            auVar230 = vblendvps_avx(auVar230,auVar102,auVar166);
            auVar102 = vblendvps_avx(auVar281,auVar284,auVar140);
            auVar276 = ZEXT3264(auVar102);
            auVar237 = vblendvps_avx(auVar237,auVar102,auVar166);
            auVar260._0_8_ = auVar10._0_8_ ^ 0xffffffffffffffff;
            auVar260._8_4_ = auVar10._8_4_ ^ 0xffffffff;
            auVar260._12_4_ = auVar10._12_4_ ^ 0xffffffff;
            auVar260._16_4_ = auVar10._16_4_ ^ 0xffffffff;
            auVar260._20_4_ = auVar10._20_4_ ^ 0xffffffff;
            auVar260._24_4_ = auVar10._24_4_ ^ 0xffffffff;
            auVar260._28_4_ = auVar10._28_4_ ^ 0xffffffff;
            auVar10 = vorps_avx(auVar140,auVar260);
            local_b80 = vandps_avx(auVar10,auVar11);
          }
        }
        local_3a0 = _local_760;
        local_380 = vminps_avx(local_340,auVar230);
        _local_4c0 = vmaxps_avx(_local_760,auVar237);
        _local_360 = _local_4c0;
        auVar10 = vcmpps_avx(_local_760,local_380,2);
        local_480 = vandps_avx(auVar10,auVar110);
        auVar10 = vcmpps_avx(_local_4c0,local_340,2);
        local_580 = vandps_avx(auVar10,auVar110);
        auVar110 = vorps_avx(local_580,local_480);
        auVar242 = local_980._0_28_;
        auVar285 = ZEXT3264(local_a00);
        auVar282 = ZEXT3264(local_a20);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
          auVar233 = ZEXT3264(local_880);
          auVar239 = ZEXT3264(local_ae0);
        }
        else {
          local_4e0._0_8_ = local_b80._0_8_ ^ 0xffffffffffffffff;
          local_4e0._8_4_ = local_b80._8_4_ ^ 0xffffffff;
          local_4e0._12_4_ = local_b80._12_4_ ^ 0xffffffff;
          local_4e0._16_4_ = local_b80._16_4_ ^ 0xffffffff;
          local_4e0._20_4_ = local_b80._20_4_ ^ 0xffffffff;
          local_4e0._24_4_ = local_b80._24_4_ ^ 0xffffffff;
          local_4e0._28_4_ = local_b80._28_4_ ^ 0xffffffff;
          auVar51._4_4_ = fVar248 * auVar206._4_4_;
          auVar51._0_4_ = fVar240 * auVar206._0_4_;
          auVar51._8_4_ = fVar249 * auVar206._8_4_;
          auVar51._12_4_ = fVar250 * auVar206._12_4_;
          auVar51._16_4_ = fVar251 * auVar206._16_4_;
          auVar51._20_4_ = fVar252 * auVar206._20_4_;
          auVar51._24_4_ = fVar253 * auVar206._24_4_;
          auVar51._28_4_ = local_b80._28_4_;
          auVar96 = vfmadd213ps_fma(auVar194,_local_960,auVar51);
          auVar96 = vfmadd213ps_fma(auVar164,_local_ac0,ZEXT1632(auVar96));
          auVar68._4_4_ = uStack_77c;
          auVar68._0_4_ = local_780;
          auVar68._8_4_ = uStack_778;
          auVar68._12_4_ = uStack_774;
          auVar68._16_4_ = uStack_770;
          auVar68._20_4_ = uStack_76c;
          auVar68._24_4_ = uStack_768;
          auVar68._28_4_ = uStack_764;
          auVar110 = vandps_avx(ZEXT1632(auVar96),auVar68);
          auVar142._8_4_ = 0x3e99999a;
          auVar142._0_8_ = 0x3e99999a3e99999a;
          auVar142._12_4_ = 0x3e99999a;
          auVar142._16_4_ = 0x3e99999a;
          auVar142._20_4_ = 0x3e99999a;
          auVar142._24_4_ = 0x3e99999a;
          auVar142._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar142,1);
          auVar110 = vorps_avx(auVar110,local_4e0);
          auVar143._8_4_ = 3;
          auVar143._0_8_ = 0x300000003;
          auVar143._12_4_ = 3;
          auVar143._16_4_ = 3;
          auVar143._20_4_ = 3;
          auVar143._24_4_ = 3;
          auVar143._28_4_ = 3;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar167,auVar143,auVar110);
          uVar82 = (undefined4)local_560;
          local_320._4_4_ = uVar82;
          local_320._0_4_ = uVar82;
          local_320._8_4_ = uVar82;
          local_320._12_4_ = uVar82;
          local_320._16_4_ = uVar82;
          local_320._20_4_ = uVar82;
          local_320._24_4_ = uVar82;
          local_320._28_4_ = uVar82;
          local_4a0 = vpcmpgtd_avx2(auVar110,local_320);
          local_500 = vpandn_avx2(local_4a0,local_480);
          auVar233 = ZEXT3264(local_500);
          auVar110 = local_480 & ~local_4a0;
          auVar239 = ZEXT3264(local_ae0);
          auStack_558 = auVar28._8_24_;
          uVar83 = local_560;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            auVar202 = vminps_avx(local_a50,local_a70);
            auVar96 = vmaxps_avx(local_a50,local_a70);
            auVar5 = vminps_avx(local_a60,_local_a80);
            auVar6 = vminps_avx(auVar202,auVar5);
            auVar202 = vmaxps_avx(local_a60,_local_a80);
            auVar5 = vmaxps_avx(auVar96,auVar202);
            auVar96 = vandps_avx(auVar6,local_8a0);
            auVar202 = vandps_avx(auVar5,local_8a0);
            auVar96 = vmaxps_avx(auVar96,auVar202);
            auVar202 = vmovshdup_avx(auVar96);
            auVar202 = vmaxss_avx(auVar202,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar202);
            local_840._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_700 = vshufps_avx(auVar5,auVar5,0xff);
            local_740._4_4_ = (float)local_760._4_4_ + (float)local_860._4_4_;
            local_740._0_4_ = (float)local_760._0_4_ + (float)local_860._0_4_;
            fStack_738 = fStack_758 + fStack_858;
            fStack_734 = fStack_754 + fStack_854;
            fStack_730 = fStack_750 + fStack_850;
            fStack_72c = fStack_74c + fStack_84c;
            fStack_728 = fStack_748 + fStack_848;
            fStack_724 = fStack_744 + fStack_844;
            local_520 = local_580;
            do {
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar110 = auVar233._0_32_;
              auVar10 = vblendvps_avx(auVar144,_local_760,auVar110);
              auVar102 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar102 = vminps_avx(auVar10,auVar102);
              auVar140 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar140);
              auVar140 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar140);
              auVar10 = vcmpps_avx(auVar10,auVar102,0);
              auVar102 = auVar110 & auVar10;
              if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar102 >> 0x7f,0) != '\0') ||
                    (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar102 >> 0xbf,0) != '\0') ||
                  (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar102[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar10,auVar110);
              }
              local_720._0_8_ = uVar79;
              uVar76 = vmovmskps_avx(auVar110);
              iVar16 = 0;
              for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar77 = iVar16 << 2;
              *(undefined4 *)(local_500 + uVar77) = 0;
              uVar76 = *(uint *)(local_440 + uVar77);
              fVar117 = *(float *)(local_3a0 + uVar77);
              fVar85 = local_ae4;
              if ((float)local_8b0._0_4_ < 0.0) {
                fVar85 = sqrtf((float)local_8b0._0_4_);
              }
              auVar233 = ZEXT464(uVar76);
              local_680._0_4_ = fVar85 * 1.9073486e-06;
              lVar80 = 5;
              do {
                fVar151 = auVar233._0_4_;
                fVar85 = 1.0 - fVar151;
                auVar121._0_4_ = local_a70._0_4_ * fVar151;
                auVar121._4_4_ = local_a70._4_4_ * fVar151;
                auVar121._8_4_ = local_a70._8_4_ * fVar151;
                auVar121._12_4_ = local_a70._12_4_ * fVar151;
                auVar158._4_4_ = fVar85;
                auVar158._0_4_ = fVar85;
                auVar158._8_4_ = fVar85;
                auVar158._12_4_ = fVar85;
                auVar96 = vfmadd231ps_fma(auVar121,auVar158,local_a50);
                auVar176._0_4_ = local_a60._0_4_ * fVar151;
                auVar176._4_4_ = local_a60._4_4_ * fVar151;
                auVar176._8_4_ = local_a60._8_4_ * fVar151;
                auVar176._12_4_ = local_a60._12_4_ * fVar151;
                auVar202 = vfmadd231ps_fma(auVar176,auVar158,local_a70);
                auVar221._0_4_ = fVar151 * auVar202._0_4_;
                auVar221._4_4_ = fVar151 * auVar202._4_4_;
                auVar221._8_4_ = fVar151 * auVar202._8_4_;
                auVar221._12_4_ = fVar151 * auVar202._12_4_;
                local_a40._0_16_ = vfmadd231ps_fma(auVar221,auVar158,auVar96);
                auVar122._0_4_ = fVar151 * (float)local_a80._0_4_;
                auVar122._4_4_ = fVar151 * (float)local_a80._4_4_;
                auVar122._8_4_ = fVar151 * fStack_a78;
                auVar122._12_4_ = fVar151 * fStack_a74;
                auVar96 = vfmadd231ps_fma(auVar122,auVar158,local_a60);
                auVar201._0_4_ = fVar151 * auVar96._0_4_;
                auVar201._4_4_ = fVar151 * auVar96._4_4_;
                auVar201._8_4_ = fVar151 * auVar96._8_4_;
                auVar201._12_4_ = fVar151 * auVar96._12_4_;
                auVar202 = vfmadd231ps_fma(auVar201,auVar158,auVar202);
                auVar123._4_4_ = fVar117;
                auVar123._0_4_ = fVar117;
                auVar123._8_4_ = fVar117;
                auVar123._12_4_ = fVar117;
                auVar96 = vfmadd213ps_fma(auVar123,local_890,_DAT_01feba10);
                auVar92._0_4_ = fVar151 * auVar202._0_4_;
                auVar92._4_4_ = fVar151 * auVar202._4_4_;
                auVar92._8_4_ = fVar151 * auVar202._8_4_;
                auVar92._12_4_ = fVar151 * auVar202._12_4_;
                auVar5 = vfmadd231ps_fma(auVar92,local_a40._0_16_,auVar158);
                local_660._0_16_ = auVar5;
                auVar96 = vsubps_avx(auVar96,auVar5);
                _local_900 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_8e0 = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  local_aa0._0_16_ = auVar202;
                  auVar282._0_4_ = sqrtf(auVar96._0_4_);
                  auVar282._4_60_ = extraout_var;
                  auVar96 = auVar282._0_16_;
                  auVar202 = local_aa0._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                }
                auVar202 = vsubps_avx(auVar202,local_a40._0_16_);
                local_a40._0_4_ = auVar202._0_4_ * 3.0;
                local_a40._4_4_ = auVar202._4_4_ * 3.0;
                local_a40._8_4_ = auVar202._8_4_ * 3.0;
                local_a40._12_4_ = auVar202._12_4_ * 3.0;
                auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar85),
                                           auVar233._0_16_);
                auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar233._0_16_,
                                         ZEXT416((uint)fVar85));
                fVar85 = fVar85 * 6.0;
                fVar86 = auVar202._0_4_ * 6.0;
                fVar156 = auVar5._0_4_ * 6.0;
                fVar152 = fVar151 * 6.0;
                auVar177._0_4_ = fVar152 * (float)local_a80._0_4_;
                auVar177._4_4_ = fVar152 * (float)local_a80._4_4_;
                auVar177._8_4_ = fVar152 * fStack_a78;
                auVar177._12_4_ = fVar152 * fStack_a74;
                auVar124._4_4_ = fVar156;
                auVar124._0_4_ = fVar156;
                auVar124._8_4_ = fVar156;
                auVar124._12_4_ = fVar156;
                auVar202 = vfmadd132ps_fma(auVar124,auVar177,local_a60);
                auVar178._4_4_ = fVar86;
                auVar178._0_4_ = fVar86;
                auVar178._8_4_ = fVar86;
                auVar178._12_4_ = fVar86;
                auVar202 = vfmadd132ps_fma(auVar178,auVar202,local_a70);
                auVar5 = vdpps_avx(local_a40._0_16_,local_a40._0_16_,0x7f);
                auVar125._4_4_ = fVar85;
                auVar125._0_4_ = fVar85;
                auVar125._8_4_ = fVar85;
                auVar125._12_4_ = fVar85;
                auVar127 = vfmadd132ps_fma(auVar125,auVar202,local_a50);
                auVar202 = vblendps_avx(auVar5,_DAT_01feba10,0xe);
                auVar6 = vrsqrtss_avx(auVar202,auVar202);
                fVar156 = auVar5._0_4_;
                fVar85 = auVar6._0_4_;
                auVar6 = vdpps_avx(local_a40._0_16_,auVar127,0x7f);
                fVar85 = fVar85 * 1.5 + fVar156 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar126._0_4_ = auVar127._0_4_ * fVar156;
                auVar126._4_4_ = auVar127._4_4_ * fVar156;
                auVar126._8_4_ = auVar127._8_4_ * fVar156;
                auVar126._12_4_ = auVar127._12_4_ * fVar156;
                fVar86 = auVar6._0_4_;
                auVar222._0_4_ = local_a40._0_4_ * fVar86;
                auVar222._4_4_ = local_a40._4_4_ * fVar86;
                auVar222._8_4_ = local_a40._8_4_ * fVar86;
                auVar222._12_4_ = local_a40._12_4_ * fVar86;
                auVar6 = vsubps_avx(auVar126,auVar222);
                auVar202 = vrcpss_avx(auVar202,auVar202);
                auVar127 = vfnmadd213ss_fma(auVar202,auVar5,ZEXT416(0x40000000));
                fVar86 = auVar202._0_4_ * auVar127._0_4_;
                auVar202 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                      ZEXT416((uint)(fVar117 * (float)local_680._0_4_)));
                uVar79 = CONCAT44(local_a40._4_4_,local_a40._0_4_);
                auVar264._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar264._8_4_ = -local_a40._8_4_;
                auVar264._12_4_ = -local_a40._12_4_;
                auVar179._0_4_ = fVar85 * auVar6._0_4_ * fVar86;
                auVar179._4_4_ = fVar85 * auVar6._4_4_ * fVar86;
                auVar179._8_4_ = fVar85 * auVar6._8_4_ * fVar86;
                auVar179._12_4_ = fVar85 * auVar6._12_4_ * fVar86;
                local_940._0_4_ = local_a40._0_4_ * fVar85;
                local_940._4_4_ = local_a40._4_4_ * fVar85;
                local_940._8_4_ = local_a40._8_4_ * fVar85;
                local_940._12_4_ = local_a40._12_4_ * fVar85;
                if (fVar156 < -fVar156) {
                  local_aa0._0_4_ = auVar96._0_4_;
                  local_920._0_16_ = auVar264;
                  local_9a0._0_16_ = auVar179;
                  fVar85 = sqrtf(fVar156);
                  auVar96 = ZEXT416((uint)local_aa0._0_4_);
                  auVar179 = local_9a0._0_16_;
                  auVar264 = local_920._0_16_;
                }
                else {
                  auVar5 = vsqrtss_avx(auVar5,auVar5);
                  fVar85 = auVar5._0_4_;
                }
                auVar266 = ZEXT1664(auVar264);
                local_aa0._0_16_ = vdpps_avx(_local_900,local_940._0_16_,0x7f);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar96,
                                         ZEXT416((uint)auVar202._0_4_));
                auVar5 = vdpps_avx(auVar264,local_940._0_16_,0x7f);
                auVar6 = vdpps_avx(_local_900,auVar179,0x7f);
                auVar127 = vdpps_avx(local_890,local_940._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_840._0_4_ / fVar85)),auVar7);
                local_920._0_4_ = auVar96._0_4_;
                auVar93._0_4_ = local_aa0._0_4_ * local_aa0._0_4_;
                auVar93._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
                auVar93._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
                auVar93._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
                auVar96 = vdpps_avx(_local_900,auVar264,0x7f);
                auVar91 = vsubps_avx(local_8e0,auVar93);
                auVar7 = vrsqrtss_avx(auVar91,auVar91);
                fVar86 = auVar91._0_4_;
                fVar85 = auVar7._0_4_;
                fVar85 = fVar85 * 1.5 + fVar86 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar7 = vdpps_avx(_local_900,local_890,0x7f);
                local_940._0_16_ = ZEXT416((uint)(auVar5._0_4_ + auVar6._0_4_));
                auVar96 = vfnmadd231ss_fma(auVar96,local_aa0._0_16_,local_940._0_16_);
                auVar5 = vfnmadd231ss_fma(auVar7,local_aa0._0_16_,auVar127);
                if (fVar86 < 0.0) {
                  local_9a0._0_16_ = auVar127;
                  local_6a0._0_16_ = auVar96;
                  local_6c0._0_4_ = fVar85;
                  local_6e0._0_16_ = auVar5;
                  auVar266 = ZEXT1664(auVar264);
                  fVar86 = sqrtf(fVar86);
                  fVar85 = (float)local_6c0._0_4_;
                  auVar5 = local_6e0._0_16_;
                  auVar127 = local_9a0._0_16_;
                  auVar96 = local_6a0._0_16_;
                }
                else {
                  auVar6 = vsqrtss_avx(auVar91,auVar91);
                  fVar86 = auVar6._0_4_;
                }
                auVar282 = ZEXT3264(local_a20);
                auVar239 = ZEXT3264(local_ae0);
                auVar6 = vpermilps_avx(local_660._0_16_,0xff);
                auVar7 = vpermilps_avx(local_a40._0_16_,0xff);
                auVar96 = vfmsub213ss_fma(auVar96,ZEXT416((uint)fVar85),auVar7);
                auVar180._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
                auVar180._8_4_ = auVar127._8_4_ ^ 0x80000000;
                auVar180._12_4_ = auVar127._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar276 = ZEXT1664(local_940._0_16_);
                auVar91 = ZEXT416((uint)(auVar5._0_4_ * fVar85));
                auVar5 = vfmsub231ss_fma(ZEXT416((uint)(auVar127._0_4_ * auVar96._0_4_)),
                                         local_940._0_16_,auVar91);
                auVar96 = vinsertps_avx(auVar91,auVar180,0x10);
                uVar82 = auVar5._0_4_;
                auVar181._4_4_ = uVar82;
                auVar181._0_4_ = uVar82;
                auVar181._8_4_ = uVar82;
                auVar181._12_4_ = uVar82;
                auVar96 = vdivps_avx(auVar96,auVar181);
                auVar127 = ZEXT416((uint)(fVar86 - auVar6._0_4_));
                auVar6 = vinsertps_avx(local_aa0._0_16_,auVar127,0x10);
                auVar159._0_4_ = auVar6._0_4_ * auVar96._0_4_;
                auVar159._4_4_ = auVar6._4_4_ * auVar96._4_4_;
                auVar159._8_4_ = auVar6._8_4_ * auVar96._8_4_;
                auVar159._12_4_ = auVar6._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar203,local_940._0_16_,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar181);
                auVar5 = vhaddps_avx(auVar159,auVar159);
                auVar182._0_4_ = auVar6._0_4_ * auVar96._0_4_;
                auVar182._4_4_ = auVar6._4_4_ * auVar96._4_4_;
                auVar182._8_4_ = auVar6._8_4_ * auVar96._8_4_;
                auVar182._12_4_ = auVar6._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar182,auVar182);
                fVar151 = fVar151 - auVar5._0_4_;
                auVar233 = ZEXT464((uint)fVar151);
                fVar117 = fVar117 - auVar96._0_4_;
                auVar96 = vandps_avx(local_aa0._0_16_,local_8a0);
                bVar52 = true;
                auVar242 = local_980._0_28_;
                if ((float)local_920._0_4_ <= auVar96._0_4_) {
LAB_016912ec:
                  auVar285 = ZEXT3264(local_a00);
                }
                else {
                  auVar202 = vfmadd231ss_fma(ZEXT416((uint)((float)local_920._0_4_ + auVar202._0_4_)
                                                    ),local_700,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar127,local_8a0);
                  if (auVar202._0_4_ <= auVar96._0_4_) goto LAB_016912ec;
                  fVar117 = fVar117 + (float)local_810._0_4_;
                  if ((fVar117 < fVar84) ||
                     (fVar85 = *(float *)(ray + k * 4 + 0x80), fVar85 < fVar117)) {
                    bVar52 = false;
                    unaff_BL = 0;
                    goto LAB_016912ec;
                  }
                  bVar52 = false;
                  if (fVar151 < 0.0) {
                    unaff_BL = 0;
                    bVar52 = false;
                    goto LAB_016912ec;
                  }
                  auVar285 = ZEXT3264(local_a00);
                  if (1.0 < fVar151) {
                    unaff_BL = 0;
                  }
                  else {
                    auVar96 = vrsqrtss_avx(local_8e0,local_8e0);
                    fVar86 = auVar96._0_4_;
                    pGVar2 = (context->scene->geometries).items[local_9d8].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      unaff_BL = 0;
                    }
                    else {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar86 = fVar86 * 1.5 + local_8e0._0_4_ * -0.5 * fVar86 * fVar86 * fVar86;
                        auVar128._0_4_ = fVar86 * (float)local_900._0_4_;
                        auVar128._4_4_ = fVar86 * (float)local_900._4_4_;
                        auVar128._8_4_ = fVar86 * fStack_8f8;
                        auVar128._12_4_ = fVar86 * fStack_8f4;
                        auVar6 = vfmadd213ps_fma(auVar7,auVar128,local_a40._0_16_);
                        auVar96 = vshufps_avx(auVar128,auVar128,0xc9);
                        auVar202 = vshufps_avx(local_a40._0_16_,local_a40._0_16_,0xc9);
                        auVar129._0_4_ = auVar128._0_4_ * auVar202._0_4_;
                        auVar129._4_4_ = auVar128._4_4_ * auVar202._4_4_;
                        auVar129._8_4_ = auVar128._8_4_ * auVar202._8_4_;
                        auVar129._12_4_ = auVar128._12_4_ * auVar202._12_4_;
                        auVar5 = vfmsub231ps_fma(auVar129,local_a40._0_16_,auVar96);
                        auVar96 = vshufps_avx(auVar5,auVar5,0xc9);
                        auVar202 = vshufps_avx(auVar6,auVar6,0xc9);
                        auVar5 = vshufps_avx(auVar5,auVar5,0xd2);
                        auVar94._0_4_ = auVar6._0_4_ * auVar5._0_4_;
                        auVar94._4_4_ = auVar6._4_4_ * auVar5._4_4_;
                        auVar94._8_4_ = auVar6._8_4_ * auVar5._8_4_;
                        auVar94._12_4_ = auVar6._12_4_ * auVar5._12_4_;
                        auVar96 = vfmsub231ps_fma(auVar94,auVar96,auVar202);
                        local_620 = (RTCHitN  [16])vshufps_avx(auVar96,auVar96,0x55);
                        auStack_610 = vshufps_avx(auVar96,auVar96,0xaa);
                        local_600 = auVar96._0_4_;
                        local_5e0 = ZEXT416(0) << 0x20;
                        local_5d0 = CONCAT44(uStack_63c,local_640);
                        uStack_5c8 = CONCAT44(uStack_634,uStack_638);
                        local_5c0._4_4_ = uStack_62c;
                        local_5c0._0_4_ = local_630;
                        local_5c0._8_4_ = uStack_628;
                        local_5c0._12_4_ = uStack_624;
                        vpcmpeqd_avx2(ZEXT1632(local_5c0),ZEXT1632(local_5c0));
                        uStack_5ac = context->user->instID[0];
                        local_5b0 = uStack_5ac;
                        uStack_5a8 = uStack_5ac;
                        uStack_5a4 = uStack_5ac;
                        uStack_5a0 = context->user->instPrimID[0];
                        uStack_59c = uStack_5a0;
                        uStack_598 = uStack_5a0;
                        uStack_594 = uStack_5a0;
                        *(float *)(ray + k * 4 + 0x80) = fVar117;
                        local_b00 = *local_9e0;
                        uStack_af8 = local_9e0[1];
                        local_9d0.valid = (int *)&local_b00;
                        local_9d0.geometryUserPtr = pGVar2->userPtr;
                        local_9d0.context = context->user;
                        local_9d0.hit = local_620;
                        local_9d0.N = 4;
                        local_9d0.ray = (RTCRayN *)ray;
                        uStack_5fc = local_600;
                        uStack_5f8 = local_600;
                        uStack_5f4 = local_600;
                        local_5f0 = fVar151;
                        fStack_5ec = fVar151;
                        fStack_5e8 = fVar151;
                        fStack_5e4 = fVar151;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          auVar276 = ZEXT1664(local_940._0_16_);
                          (*pGVar2->occlusionFilterN)(&local_9d0);
                          auVar233 = ZEXT1664(ZEXT416((uint)fVar151));
                          auVar239 = ZEXT3264(local_ae0);
                          auVar282 = ZEXT3264(local_a20);
                          auVar285 = ZEXT3264(local_a00);
                        }
                        auVar242 = local_980._0_28_;
                        auVar61._8_8_ = uStack_af8;
                        auVar61._0_8_ = local_b00;
                        if (auVar61 == (undefined1  [16])0x0) {
                          auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar96 = auVar96 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            (*p_Var3)(&local_9d0);
                            auVar233 = ZEXT1664(ZEXT416((uint)fVar151));
                            auVar239 = ZEXT3264(local_ae0);
                            auVar282 = ZEXT3264(local_a20);
                            auVar285 = ZEXT3264(local_a00);
                            auVar242 = local_980._0_28_;
                          }
                          auVar62._8_8_ = uStack_af8;
                          auVar62._0_8_ = local_b00;
                          auVar202 = vpcmpeqd_avx((undefined1  [16])0x0,auVar62);
                          auVar96 = auVar202 ^ _DAT_01febe20;
                          auVar160._8_4_ = 0xff800000;
                          auVar160._0_8_ = 0xff800000ff800000;
                          auVar160._12_4_ = 0xff800000;
                          auVar202 = vblendvps_avx(auVar160,*(undefined1 (*) [16])
                                                             (local_9d0.ray + 0x80),auVar202);
                          *(undefined1 (*) [16])(local_9d0.ray + 0x80) = auVar202;
                        }
                        auVar130._8_8_ = 0x100000001;
                        auVar130._0_8_ = 0x100000001;
                        unaff_BL = (auVar130 & auVar96) != (undefined1  [16])0x0;
                        if (!(bool)unaff_BL) {
                          *(float *)(ray + k * 4 + 0x80) = fVar85;
                        }
                        bVar52 = false;
                        goto LAB_016912f1;
                      }
                      unaff_BL = 1;
                    }
                    bVar52 = false;
                  }
                }
LAB_016912f1:
                if (!bVar52) goto LAB_01691686;
                lVar80 = lVar80 + -1;
              } while (lVar80 != 0);
              unaff_BL = 0;
LAB_01691686:
              unaff_BL = unaff_BL & 1;
              uVar79 = CONCAT71(local_720._1_7_,local_720[0] | unaff_BL);
              uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar111._4_4_ = uVar82;
              auVar111._0_4_ = uVar82;
              auVar111._8_4_ = uVar82;
              auVar111._12_4_ = uVar82;
              auVar111._16_4_ = uVar82;
              auVar111._20_4_ = uVar82;
              auVar111._24_4_ = uVar82;
              auVar111._28_4_ = uVar82;
              auVar10 = vcmpps_avx(_local_740,auVar111,2);
              auVar110 = vandps_avx(auVar10,local_500);
              auVar233 = ZEXT3264(auVar110);
              auVar10 = local_500 & auVar10;
              uVar83 = local_560;
              local_500 = auVar110;
            } while ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar10 >> 0x7f,0) != '\0') ||
                       (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar10 >> 0xbf,0) != '\0') ||
                     (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar10[0x1f] < '\0');
          }
          auVar116._0_4_ = auVar242._0_4_ * (float)local_7e0._0_4_;
          auVar116._4_4_ = auVar242._4_4_ * (float)local_7e0._4_4_;
          auVar116._8_4_ = auVar242._8_4_ * fStack_7d8;
          auVar116._12_4_ = auVar242._12_4_ * fStack_7d4;
          auVar116._16_4_ = auVar242._16_4_ * fStack_7d0;
          auVar116._20_4_ = auVar242._20_4_ * fStack_7cc;
          auVar116._28_36_ = auVar233._28_36_;
          auVar116._24_4_ = auVar242._24_4_ * fStack_7c8;
          auVar96 = vfmadd213ps_fma(local_7c0,_local_960,auVar116._0_32_);
          auVar96 = vfmadd213ps_fma(_local_7a0,_local_ac0,ZEXT1632(auVar96));
          auVar69._4_4_ = uStack_77c;
          auVar69._0_4_ = local_780;
          auVar69._8_4_ = uStack_778;
          auVar69._12_4_ = uStack_774;
          auVar69._16_4_ = uStack_770;
          auVar69._20_4_ = uStack_76c;
          auVar69._24_4_ = uStack_768;
          auVar69._28_4_ = uStack_764;
          auVar110 = vandps_avx(ZEXT1632(auVar96),auVar69);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar145,1);
          auVar10 = vorps_avx(auVar110,local_4e0);
          auVar146._0_4_ = (float)local_860._0_4_ + (float)local_4c0._0_4_;
          auVar146._4_4_ = (float)local_860._4_4_ + (float)local_4c0._4_4_;
          auVar146._8_4_ = fStack_858 + fStack_4b8;
          auVar146._12_4_ = fStack_854 + fStack_4b4;
          auVar146._16_4_ = fStack_850 + fStack_4b0;
          auVar146._20_4_ = fStack_84c + fStack_4ac;
          auVar146._24_4_ = fStack_848 + fStack_4a8;
          auVar146._28_4_ = fStack_844 + fStack_4a4;
          uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar168._4_4_ = uVar82;
          auVar168._0_4_ = uVar82;
          auVar168._8_4_ = uVar82;
          auVar168._12_4_ = uVar82;
          auVar168._16_4_ = uVar82;
          auVar168._20_4_ = uVar82;
          auVar168._24_4_ = uVar82;
          auVar168._28_4_ = uVar82;
          auVar110 = vcmpps_avx(auVar146,auVar168,2);
          local_7c0 = vandps_avx(auVar110,local_580);
          auVar147._8_4_ = 3;
          auVar147._0_8_ = 0x300000003;
          auVar147._12_4_ = 3;
          auVar147._16_4_ = 3;
          auVar147._20_4_ = 3;
          auVar147._24_4_ = 3;
          auVar147._28_4_ = 3;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar169,auVar147,auVar10);
          _local_7e0 = vpcmpgtd_avx2(auVar110,local_320);
          auVar110 = vpandn_avx2(_local_7e0,local_7c0);
          auVar10 = local_7c0 & ~_local_7e0;
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
            auVar233 = ZEXT3264(local_880);
            local_560 = uVar83;
          }
          else {
            auVar202 = vminps_avx(local_a50,local_a70);
            auVar96 = vmaxps_avx(local_a50,local_a70);
            auVar5 = vminps_avx(local_a60,_local_a80);
            auVar6 = vminps_avx(auVar202,auVar5);
            auVar202 = vmaxps_avx(local_a60,_local_a80);
            auVar5 = vmaxps_avx(auVar96,auVar202);
            auVar96 = vandps_avx(auVar6,local_8a0);
            auVar202 = vandps_avx(auVar5,local_8a0);
            auVar96 = vmaxps_avx(auVar96,auVar202);
            auVar202 = vmovshdup_avx(auVar96);
            auVar202 = vmaxss_avx(auVar202,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar202);
            local_840._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_700 = vshufps_avx(auVar5,auVar5,0xff);
            _local_740 = _local_360;
            local_7a0._4_4_ = (float)local_860._4_4_ + (float)local_360._4_4_;
            local_7a0._0_4_ = (float)local_860._0_4_ + (float)local_360._0_4_;
            fStack_798 = fStack_858 + fStack_358;
            fStack_794 = fStack_854 + fStack_354;
            fStack_790 = fStack_850 + fStack_350;
            fStack_78c = fStack_84c + fStack_34c;
            fStack_788 = fStack_848 + fStack_348;
            fStack_784 = fStack_844 + fStack_344;
            do {
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar10 = vblendvps_avx(auVar148,_local_740,auVar110);
              auVar102 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar102 = vminps_avx(auVar10,auVar102);
              auVar140 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar140);
              auVar140 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar140);
              auVar102 = vcmpps_avx(auVar10,auVar102,0);
              auVar140 = auVar110 & auVar102;
              auVar10 = auVar110;
              if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar140 >> 0x7f,0) != '\0') ||
                    (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar140 >> 0xbf,0) != '\0') ||
                  (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar140[0x1f] < '\0') {
                auVar10 = vandps_avx(auVar102,auVar110);
              }
              local_720._0_8_ = uVar79;
              uVar76 = vmovmskps_avx(auVar10);
              iVar16 = 0;
              for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar77 = iVar16 << 2;
              local_520 = auVar110;
              *(undefined4 *)(local_520 + uVar77) = 0;
              uVar76 = *(uint *)(local_460 + uVar77);
              fVar117 = *(float *)(local_340 + uVar77);
              fVar85 = local_ae8;
              if ((float)local_8b0._0_4_ < 0.0) {
                fVar85 = sqrtf((float)local_8b0._0_4_);
              }
              auVar282 = ZEXT464(uVar76);
              local_680._0_4_ = fVar85 * 1.9073486e-06;
              lVar80 = 5;
              do {
                fVar151 = auVar282._0_4_;
                fVar85 = 1.0 - fVar151;
                auVar131._0_4_ = local_a70._0_4_ * fVar151;
                auVar131._4_4_ = local_a70._4_4_ * fVar151;
                auVar131._8_4_ = local_a70._8_4_ * fVar151;
                auVar131._12_4_ = local_a70._12_4_ * fVar151;
                auVar161._4_4_ = fVar85;
                auVar161._0_4_ = fVar85;
                auVar161._8_4_ = fVar85;
                auVar161._12_4_ = fVar85;
                auVar96 = vfmadd231ps_fma(auVar131,auVar161,local_a50);
                auVar183._0_4_ = local_a60._0_4_ * fVar151;
                auVar183._4_4_ = local_a60._4_4_ * fVar151;
                auVar183._8_4_ = local_a60._8_4_ * fVar151;
                auVar183._12_4_ = local_a60._12_4_ * fVar151;
                auVar202 = vfmadd231ps_fma(auVar183,auVar161,local_a70);
                auVar223._0_4_ = fVar151 * auVar202._0_4_;
                auVar223._4_4_ = fVar151 * auVar202._4_4_;
                auVar223._8_4_ = fVar151 * auVar202._8_4_;
                auVar223._12_4_ = fVar151 * auVar202._12_4_;
                local_a40._0_16_ = vfmadd231ps_fma(auVar223,auVar161,auVar96);
                auVar132._0_4_ = fVar151 * (float)local_a80._0_4_;
                auVar132._4_4_ = fVar151 * (float)local_a80._4_4_;
                auVar132._8_4_ = fVar151 * fStack_a78;
                auVar132._12_4_ = fVar151 * fStack_a74;
                auVar96 = vfmadd231ps_fma(auVar132,auVar161,local_a60);
                auVar204._0_4_ = fVar151 * auVar96._0_4_;
                auVar204._4_4_ = fVar151 * auVar96._4_4_;
                auVar204._8_4_ = fVar151 * auVar96._8_4_;
                auVar204._12_4_ = fVar151 * auVar96._12_4_;
                auVar202 = vfmadd231ps_fma(auVar204,auVar161,auVar202);
                auVar133._4_4_ = fVar117;
                auVar133._0_4_ = fVar117;
                auVar133._8_4_ = fVar117;
                auVar133._12_4_ = fVar117;
                auVar96 = vfmadd213ps_fma(auVar133,local_890,_DAT_01feba10);
                auVar95._0_4_ = fVar151 * auVar202._0_4_;
                auVar95._4_4_ = fVar151 * auVar202._4_4_;
                auVar95._8_4_ = fVar151 * auVar202._8_4_;
                auVar95._12_4_ = fVar151 * auVar202._12_4_;
                auVar5 = vfmadd231ps_fma(auVar95,local_a40._0_16_,auVar161);
                local_660._0_16_ = auVar5;
                auVar96 = vsubps_avx(auVar96,auVar5);
                _local_900 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_8e0 = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  local_aa0._0_16_ = auVar202;
                  auVar285._0_4_ = sqrtf(auVar96._0_4_);
                  auVar285._4_60_ = extraout_var_00;
                  auVar96 = auVar285._0_16_;
                  auVar202 = local_aa0._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                }
                auVar202 = vsubps_avx(auVar202,local_a40._0_16_);
                local_a40._0_4_ = auVar202._0_4_ * 3.0;
                local_a40._4_4_ = auVar202._4_4_ * 3.0;
                local_a40._8_4_ = auVar202._8_4_ * 3.0;
                local_a40._12_4_ = auVar202._12_4_ * 3.0;
                auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar85),
                                           auVar282._0_16_);
                auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar282._0_16_,
                                         ZEXT416((uint)fVar85));
                fVar85 = fVar85 * 6.0;
                fVar86 = auVar202._0_4_ * 6.0;
                fVar156 = auVar5._0_4_ * 6.0;
                fVar152 = fVar151 * 6.0;
                auVar184._0_4_ = fVar152 * (float)local_a80._0_4_;
                auVar184._4_4_ = fVar152 * (float)local_a80._4_4_;
                auVar184._8_4_ = fVar152 * fStack_a78;
                auVar184._12_4_ = fVar152 * fStack_a74;
                auVar134._4_4_ = fVar156;
                auVar134._0_4_ = fVar156;
                auVar134._8_4_ = fVar156;
                auVar134._12_4_ = fVar156;
                auVar202 = vfmadd132ps_fma(auVar134,auVar184,local_a60);
                auVar185._4_4_ = fVar86;
                auVar185._0_4_ = fVar86;
                auVar185._8_4_ = fVar86;
                auVar185._12_4_ = fVar86;
                auVar202 = vfmadd132ps_fma(auVar185,auVar202,local_a70);
                auVar5 = vdpps_avx(local_a40._0_16_,local_a40._0_16_,0x7f);
                auVar135._4_4_ = fVar85;
                auVar135._0_4_ = fVar85;
                auVar135._8_4_ = fVar85;
                auVar135._12_4_ = fVar85;
                auVar127 = vfmadd132ps_fma(auVar135,auVar202,local_a50);
                auVar202 = vblendps_avx(auVar5,_DAT_01feba10,0xe);
                auVar6 = vrsqrtss_avx(auVar202,auVar202);
                fVar156 = auVar5._0_4_;
                fVar85 = auVar6._0_4_;
                auVar6 = vdpps_avx(local_a40._0_16_,auVar127,0x7f);
                fVar85 = fVar85 * 1.5 + fVar156 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar136._0_4_ = auVar127._0_4_ * fVar156;
                auVar136._4_4_ = auVar127._4_4_ * fVar156;
                auVar136._8_4_ = auVar127._8_4_ * fVar156;
                auVar136._12_4_ = auVar127._12_4_ * fVar156;
                fVar86 = auVar6._0_4_;
                auVar224._0_4_ = local_a40._0_4_ * fVar86;
                auVar224._4_4_ = local_a40._4_4_ * fVar86;
                auVar224._8_4_ = local_a40._8_4_ * fVar86;
                auVar224._12_4_ = local_a40._12_4_ * fVar86;
                auVar6 = vsubps_avx(auVar136,auVar224);
                auVar202 = vrcpss_avx(auVar202,auVar202);
                auVar127 = vfnmadd213ss_fma(auVar202,auVar5,ZEXT416(0x40000000));
                fVar86 = auVar202._0_4_ * auVar127._0_4_;
                auVar202 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                      ZEXT416((uint)(fVar117 * (float)local_680._0_4_)));
                uVar79 = CONCAT44(local_a40._4_4_,local_a40._0_4_);
                auVar256._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar256._8_4_ = -local_a40._8_4_;
                auVar256._12_4_ = -local_a40._12_4_;
                auVar186._0_4_ = fVar85 * auVar6._0_4_ * fVar86;
                auVar186._4_4_ = fVar85 * auVar6._4_4_ * fVar86;
                auVar186._8_4_ = fVar85 * auVar6._8_4_ * fVar86;
                auVar186._12_4_ = fVar85 * auVar6._12_4_ * fVar86;
                local_940._0_4_ = local_a40._0_4_ * fVar85;
                local_940._4_4_ = local_a40._4_4_ * fVar85;
                local_940._8_4_ = local_a40._8_4_ * fVar85;
                local_940._12_4_ = local_a40._12_4_ * fVar85;
                if (fVar156 < -fVar156) {
                  local_aa0._0_4_ = auVar96._0_4_;
                  local_920._0_16_ = auVar256;
                  local_9a0._0_16_ = auVar186;
                  fVar85 = sqrtf(fVar156);
                  auVar96 = ZEXT416((uint)local_aa0._0_4_);
                  auVar186 = local_9a0._0_16_;
                  auVar256 = local_920._0_16_;
                }
                else {
                  auVar5 = vsqrtss_avx(auVar5,auVar5);
                  fVar85 = auVar5._0_4_;
                }
                local_aa0._0_16_ = vdpps_avx(_local_900,local_940._0_16_,0x7f);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar96,
                                         ZEXT416((uint)auVar202._0_4_));
                auVar5 = vdpps_avx(auVar256,local_940._0_16_,0x7f);
                auVar6 = vdpps_avx(_local_900,auVar186,0x7f);
                auVar127 = vdpps_avx(local_890,local_940._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_840._0_4_ / fVar85)),auVar7);
                local_920._0_4_ = auVar96._0_4_;
                auVar97._0_4_ = local_aa0._0_4_ * local_aa0._0_4_;
                auVar97._4_4_ = local_aa0._4_4_ * local_aa0._4_4_;
                auVar97._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
                auVar97._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
                auVar96 = vdpps_avx(_local_900,auVar256,0x7f);
                auVar91 = vsubps_avx(local_8e0,auVar97);
                auVar7 = vrsqrtss_avx(auVar91,auVar91);
                fVar86 = auVar91._0_4_;
                fVar85 = auVar7._0_4_;
                fVar85 = fVar85 * 1.5 + fVar86 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar7 = vdpps_avx(_local_900,local_890,0x7f);
                local_940._0_16_ = ZEXT416((uint)(auVar5._0_4_ + auVar6._0_4_));
                auVar96 = vfnmadd231ss_fma(auVar96,local_aa0._0_16_,local_940._0_16_);
                auVar5 = vfnmadd231ss_fma(auVar7,local_aa0._0_16_,auVar127);
                if (fVar86 < 0.0) {
                  local_9a0._0_16_ = auVar127;
                  local_6a0._0_16_ = auVar96;
                  local_6c0._0_4_ = fVar85;
                  local_6e0._0_16_ = auVar5;
                  fVar86 = sqrtf(fVar86);
                  fVar85 = (float)local_6c0._0_4_;
                  auVar5 = local_6e0._0_16_;
                  auVar127 = local_9a0._0_16_;
                  auVar96 = local_6a0._0_16_;
                }
                else {
                  auVar6 = vsqrtss_avx(auVar91,auVar91);
                  fVar86 = auVar6._0_4_;
                }
                auVar285 = ZEXT3264(local_a00);
                auVar239 = ZEXT3264(local_ae0);
                auVar6 = vpermilps_avx(local_660._0_16_,0xff);
                auVar7 = vpermilps_avx(local_a40._0_16_,0xff);
                auVar96 = vfmsub213ss_fma(auVar96,ZEXT416((uint)fVar85),auVar7);
                auVar187._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = auVar127._8_4_ ^ 0x80000000;
                auVar187._12_4_ = auVar127._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar266 = ZEXT1664(local_940._0_16_);
                auVar91 = ZEXT416((uint)(auVar5._0_4_ * fVar85));
                auVar5 = vfmsub231ss_fma(ZEXT416((uint)(auVar127._0_4_ * auVar96._0_4_)),
                                         local_940._0_16_,auVar91);
                auVar96 = vinsertps_avx(auVar91,auVar187,0x10);
                uVar82 = auVar5._0_4_;
                auVar188._4_4_ = uVar82;
                auVar188._0_4_ = uVar82;
                auVar188._8_4_ = uVar82;
                auVar188._12_4_ = uVar82;
                auVar96 = vdivps_avx(auVar96,auVar188);
                auVar276 = ZEXT1664(local_aa0._0_16_);
                auVar127 = ZEXT416((uint)(fVar86 - auVar6._0_4_));
                auVar6 = vinsertps_avx(local_aa0._0_16_,auVar127,0x10);
                auVar162._0_4_ = auVar6._0_4_ * auVar96._0_4_;
                auVar162._4_4_ = auVar6._4_4_ * auVar96._4_4_;
                auVar162._8_4_ = auVar6._8_4_ * auVar96._8_4_;
                auVar162._12_4_ = auVar6._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar205,local_940._0_16_,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar188);
                auVar5 = vhaddps_avx(auVar162,auVar162);
                auVar189._0_4_ = auVar6._0_4_ * auVar96._0_4_;
                auVar189._4_4_ = auVar6._4_4_ * auVar96._4_4_;
                auVar189._8_4_ = auVar6._8_4_ * auVar96._8_4_;
                auVar189._12_4_ = auVar6._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar189,auVar189);
                fVar151 = fVar151 - auVar5._0_4_;
                auVar282 = ZEXT464((uint)fVar151);
                fVar117 = fVar117 - auVar96._0_4_;
                auVar96 = vandps_avx(local_aa0._0_16_,local_8a0);
                bVar52 = true;
                if ((float)local_920._0_4_ <= auVar96._0_4_) {
                  auVar233 = ZEXT3264(local_880);
                }
                else {
                  auVar202 = vfmadd231ss_fma(ZEXT416((uint)((float)local_920._0_4_ + auVar202._0_4_)
                                                    ),local_700,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar127,local_8a0);
                  auVar233 = ZEXT3264(local_880);
                  if (auVar96._0_4_ < auVar202._0_4_) {
                    fVar117 = fVar117 + (float)local_810._0_4_;
                    if ((((fVar84 <= fVar117) &&
                         (fVar85 = *(float *)(ray + k * 4 + 0x80), fVar117 <= fVar85)) &&
                        (0.0 <= fVar151)) && (fVar151 <= 1.0)) {
                      auVar96 = vrsqrtss_avx(local_8e0,local_8e0);
                      fVar86 = auVar96._0_4_;
                      pGVar2 = (context->scene->geometries).items[local_9d8].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar86 = fVar86 * 1.5 + local_8e0._0_4_ * -0.5 * fVar86 * fVar86 * fVar86;
                          auVar137._0_4_ = fVar86 * (float)local_900._0_4_;
                          auVar137._4_4_ = fVar86 * (float)local_900._4_4_;
                          auVar137._8_4_ = fVar86 * fStack_8f8;
                          auVar137._12_4_ = fVar86 * fStack_8f4;
                          auVar6 = vfmadd213ps_fma(auVar7,auVar137,local_a40._0_16_);
                          auVar96 = vshufps_avx(auVar137,auVar137,0xc9);
                          auVar202 = vshufps_avx(local_a40._0_16_,local_a40._0_16_,0xc9);
                          auVar138._0_4_ = auVar137._0_4_ * auVar202._0_4_;
                          auVar138._4_4_ = auVar137._4_4_ * auVar202._4_4_;
                          auVar138._8_4_ = auVar137._8_4_ * auVar202._8_4_;
                          auVar138._12_4_ = auVar137._12_4_ * auVar202._12_4_;
                          auVar5 = vfmsub231ps_fma(auVar138,local_a40._0_16_,auVar96);
                          auVar96 = vshufps_avx(auVar5,auVar5,0xc9);
                          auVar202 = vshufps_avx(auVar6,auVar6,0xc9);
                          auVar5 = vshufps_avx(auVar5,auVar5,0xd2);
                          auVar98._0_4_ = auVar6._0_4_ * auVar5._0_4_;
                          auVar98._4_4_ = auVar6._4_4_ * auVar5._4_4_;
                          auVar98._8_4_ = auVar6._8_4_ * auVar5._8_4_;
                          auVar98._12_4_ = auVar6._12_4_ * auVar5._12_4_;
                          auVar96 = vfmsub231ps_fma(auVar98,auVar96,auVar202);
                          local_620 = (RTCHitN  [16])vshufps_avx(auVar96,auVar96,0x55);
                          auStack_610 = vshufps_avx(auVar96,auVar96,0xaa);
                          local_600 = auVar96._0_4_;
                          local_5e0 = ZEXT416(0) << 0x20;
                          local_5d0 = CONCAT44(uStack_63c,local_640);
                          uStack_5c8 = CONCAT44(uStack_634,uStack_638);
                          local_5c0._4_4_ = uStack_62c;
                          local_5c0._0_4_ = local_630;
                          local_5c0._8_4_ = uStack_628;
                          local_5c0._12_4_ = uStack_624;
                          vpcmpeqd_avx2(ZEXT1632(local_5c0),ZEXT1632(local_5c0));
                          uStack_5ac = context->user->instID[0];
                          local_5b0 = uStack_5ac;
                          uStack_5a8 = uStack_5ac;
                          uStack_5a4 = uStack_5ac;
                          uStack_5a0 = context->user->instPrimID[0];
                          uStack_59c = uStack_5a0;
                          uStack_598 = uStack_5a0;
                          uStack_594 = uStack_5a0;
                          *(float *)(ray + k * 4 + 0x80) = fVar117;
                          local_b00 = *local_9e0;
                          uStack_af8 = local_9e0[1];
                          local_9d0.valid = (int *)&local_b00;
                          local_9d0.geometryUserPtr = pGVar2->userPtr;
                          local_9d0.context = context->user;
                          local_9d0.hit = local_620;
                          local_9d0.N = 4;
                          local_9d0.ray = (RTCRayN *)ray;
                          uStack_5fc = local_600;
                          uStack_5f8 = local_600;
                          uStack_5f4 = local_600;
                          local_5f0 = fVar151;
                          fStack_5ec = fVar151;
                          fStack_5e8 = fVar151;
                          fStack_5e4 = fVar151;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar266 = ZEXT1664(local_940._0_16_);
                            auVar276 = ZEXT1664(local_aa0._0_16_);
                            (*pGVar2->occlusionFilterN)(&local_9d0);
                            auVar282 = ZEXT1664(ZEXT416((uint)fVar151));
                            auVar239 = ZEXT3264(local_ae0);
                            auVar285 = ZEXT3264(local_a00);
                            auVar233 = ZEXT3264(local_880);
                          }
                          auVar63._8_8_ = uStack_af8;
                          auVar63._0_8_ = local_b00;
                          if (auVar63 == (undefined1  [16])0x0) {
                            auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                            auVar96 = auVar96 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var3 = context->args->filter;
                            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              auVar276 = ZEXT1664(auVar276._0_16_);
                              (*p_Var3)(&local_9d0);
                              auVar282 = ZEXT1664(ZEXT416((uint)fVar151));
                              auVar239 = ZEXT3264(local_ae0);
                              auVar285 = ZEXT3264(local_a00);
                              auVar233 = ZEXT3264(local_880);
                            }
                            auVar64._8_8_ = uStack_af8;
                            auVar64._0_8_ = local_b00;
                            auVar202 = vpcmpeqd_avx((undefined1  [16])0x0,auVar64);
                            auVar96 = auVar202 ^ _DAT_01febe20;
                            auVar163._8_4_ = 0xff800000;
                            auVar163._0_8_ = 0xff800000ff800000;
                            auVar163._12_4_ = 0xff800000;
                            auVar202 = vblendvps_avx(auVar163,*(undefined1 (*) [16])
                                                               (local_9d0.ray + 0x80),auVar202);
                            *(undefined1 (*) [16])(local_9d0.ray + 0x80) = auVar202;
                          }
                          auVar139._8_8_ = 0x100000001;
                          auVar139._0_8_ = 0x100000001;
                          unaff_BL = (auVar139 & auVar96) != (undefined1  [16])0x0;
                          if (!(bool)unaff_BL) {
                            *(float *)(ray + k * 4 + 0x80) = fVar85;
                          }
                        }
                        bVar52 = false;
                        goto LAB_01691de1;
                      }
                    }
                    bVar52 = false;
                    unaff_BL = 0;
                  }
                }
LAB_01691de1:
                if (!bVar52) goto LAB_01692129;
                lVar80 = lVar80 + -1;
              } while (lVar80 != 0);
              unaff_BL = 0;
LAB_01692129:
              unaff_BL = unaff_BL & 1;
              uVar79 = CONCAT71(local_720._1_7_,local_720[0] | unaff_BL);
              uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar112._4_4_ = uVar82;
              auVar112._0_4_ = uVar82;
              auVar112._8_4_ = uVar82;
              auVar112._12_4_ = uVar82;
              auVar112._16_4_ = uVar82;
              auVar112._20_4_ = uVar82;
              auVar112._24_4_ = uVar82;
              auVar112._28_4_ = uVar82;
              auVar10 = vcmpps_avx(_local_7a0,auVar112,2);
              auVar110 = vandps_avx(auVar10,local_520);
              local_520 = local_520 & auVar10;
              auVar282 = ZEXT3264(local_a20);
            } while ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_520 >> 0x7f,0) != '\0') ||
                       (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_520 >> 0xbf,0) != '\0') ||
                     (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_520[0x1f] < '\0');
          }
          auVar149._0_4_ = (float)local_860._0_4_ + local_3a0._0_4_;
          auVar149._4_4_ = (float)local_860._4_4_ + local_3a0._4_4_;
          auVar149._8_4_ = fStack_858 + local_3a0._8_4_;
          auVar149._12_4_ = fStack_854 + local_3a0._12_4_;
          auVar149._16_4_ = fStack_850 + local_3a0._16_4_;
          auVar149._20_4_ = fStack_84c + local_3a0._20_4_;
          auVar149._24_4_ = fStack_848 + local_3a0._24_4_;
          auVar149._28_4_ = fStack_844 + local_3a0._28_4_;
          uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar196._4_4_ = uVar82;
          auVar196._0_4_ = uVar82;
          auVar196._8_4_ = uVar82;
          auVar196._12_4_ = uVar82;
          auVar196._16_4_ = uVar82;
          auVar196._20_4_ = uVar82;
          auVar196._24_4_ = uVar82;
          auVar196._28_4_ = uVar82;
          auVar10 = vcmpps_avx(auVar149,auVar196,2);
          auVar110 = vandps_avx(local_4a0,local_480);
          auVar110 = vandps_avx(auVar10,auVar110);
          auVar209._0_4_ = (float)local_860._0_4_ + local_360._0_4_;
          auVar209._4_4_ = (float)local_860._4_4_ + local_360._4_4_;
          auVar209._8_4_ = fStack_858 + local_360._8_4_;
          auVar209._12_4_ = fStack_854 + local_360._12_4_;
          auVar209._16_4_ = fStack_850 + local_360._16_4_;
          auVar209._20_4_ = fStack_84c + local_360._20_4_;
          auVar209._24_4_ = fStack_848 + local_360._24_4_;
          auVar209._28_4_ = fStack_844 + local_360._28_4_;
          auVar102 = vcmpps_avx(auVar209,auVar196,2);
          auVar10 = vandps_avx(_local_7e0,local_7c0);
          auVar10 = vandps_avx(auVar102,auVar10);
          auVar10 = vorps_avx(auVar110,auVar10);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar10;
            auVar110 = vblendvps_avx(_local_360,local_3a0,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar110;
            uVar87 = vmovlps_avx(local_800);
            *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar87;
            auStack_138[uVar78 * 0x18] = (int)local_560 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
        }
      }
    }
    do {
      uVar75 = uStack_528;
      uVar74 = uStack_530;
      uVar73 = uStack_538;
      uVar87 = local_540;
      uVar76 = (uint)uVar78;
      if (uVar76 == 0) {
        if ((uVar79 & 1) != 0) {
          return local_b89;
        }
        uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar99._4_4_ = uVar82;
        auVar99._0_4_ = uVar82;
        auVar99._8_4_ = uVar82;
        auVar99._12_4_ = uVar82;
        auVar96 = vcmpps_avx(local_410,auVar99,2);
        uVar76 = vmovmskps_avx(auVar96);
        uVar76 = uVar76 & (uint)local_7e8 - 1 & (uint)local_7e8;
        local_b89 = uVar76 != 0;
        if (!local_b89) {
          return local_b89;
        }
        goto LAB_0168fcfd;
      }
      uVar78 = (ulong)(uVar76 - 1);
      lVar80 = uVar78 * 0x60;
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar113._0_4_ = (float)local_860._0_4_ + auVar110._0_4_;
      auVar113._4_4_ = (float)local_860._4_4_ + auVar110._4_4_;
      auVar113._8_4_ = fStack_858 + auVar110._8_4_;
      auVar113._12_4_ = fStack_854 + auVar110._12_4_;
      auVar113._16_4_ = fStack_850 + auVar110._16_4_;
      auVar113._20_4_ = fStack_84c + auVar110._20_4_;
      auVar113._24_4_ = fStack_848 + auVar110._24_4_;
      auVar113._28_4_ = fStack_844 + auVar110._28_4_;
      uVar82 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar197._4_4_ = uVar82;
      auVar197._0_4_ = uVar82;
      auVar197._8_4_ = uVar82;
      auVar197._12_4_ = uVar82;
      auVar197._16_4_ = uVar82;
      auVar197._20_4_ = uVar82;
      auVar197._24_4_ = uVar82;
      auVar197._28_4_ = uVar82;
      auVar10 = vcmpps_avx(auVar113,auVar197,2);
      _local_620 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar80));
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar10;
      bVar59 = (auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar58 = (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = SUB321(auVar10 >> 0x7f,0) == '\0';
      bVar56 = (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = SUB321(auVar10 >> 0xbf,0) == '\0';
      bVar54 = (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = -1 < auVar10[0x1f];
      if (((((((!bVar59 || !bVar60) || !bVar58) || !bVar57) || !bVar56) || !bVar55) || !bVar54) ||
          !bVar52) {
        auVar170._8_4_ = 0x7f800000;
        auVar170._0_8_ = 0x7f8000007f800000;
        auVar170._12_4_ = 0x7f800000;
        auVar170._16_4_ = 0x7f800000;
        auVar170._20_4_ = 0x7f800000;
        auVar170._24_4_ = 0x7f800000;
        auVar170._28_4_ = 0x7f800000;
        auVar110 = vblendvps_avx(auVar170,auVar110,_local_620);
        auVar10 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar10 = vminps_avx(auVar110,auVar10);
        auVar102 = vshufpd_avx(auVar10,auVar10,5);
        auVar10 = vminps_avx(auVar10,auVar102);
        auVar102 = vpermpd_avx2(auVar10,0x4e);
        auVar10 = vminps_avx(auVar10,auVar102);
        auVar10 = vcmpps_avx(auVar110,auVar10,0);
        auVar102 = _local_620 & auVar10;
        auVar110 = _local_620;
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0x7f,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0xbf,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar102[0x1f] < '\0') {
          auVar110 = vandps_avx(auVar10,_local_620);
        }
        fVar117 = afStack_140[uVar78 * 0x18 + 1];
        uVar77 = auStack_138[uVar78 * 0x18];
        uVar81 = vmovmskps_avx(auVar110);
        iVar16 = 0;
        for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
          iVar16 = iVar16 + 1;
        }
        fVar85 = afStack_140[uVar78 * 0x18];
        auVar114._4_4_ = fVar85;
        auVar114._0_4_ = fVar85;
        auVar114._8_4_ = fVar85;
        auVar114._12_4_ = fVar85;
        auVar114._16_4_ = fVar85;
        auVar114._20_4_ = fVar85;
        auVar114._24_4_ = fVar85;
        auVar114._28_4_ = fVar85;
        *(undefined4 *)(local_620 + (uint)(iVar16 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar80) = _local_620;
        uVar81 = uVar76 - 1;
        if ((((((((_local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_620 >> 0x7f,0) != '\0') ||
              (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_620 >> 0xbf,0) != '\0') ||
            (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_620[0x1f] < '\0') {
          uVar81 = uVar76;
        }
        fVar117 = fVar117 - fVar85;
        auVar150._4_4_ = fVar117;
        auVar150._0_4_ = fVar117;
        auVar150._8_4_ = fVar117;
        auVar150._12_4_ = fVar117;
        auVar150._16_4_ = fVar117;
        auVar150._20_4_ = fVar117;
        auVar150._24_4_ = fVar117;
        auVar150._28_4_ = fVar117;
        auVar96 = vfmadd132ps_fma(auVar150,auVar114,_DAT_02020f20);
        local_3a0 = ZEXT1632(auVar96);
        local_800._8_8_ = 0;
        local_800._0_8_ = *(ulong *)(local_3a0 + (uint)(iVar16 << 2));
        uVar78 = (ulong)uVar81;
        local_560 = (ulong)uVar77;
      }
      auVar10._8_8_ = uVar73;
      auVar10._0_8_ = uVar87;
      auVar10._16_8_ = uVar74;
      auVar10._24_8_ = uVar75;
    } while (((((((bVar59 && bVar60) && bVar58) && bVar57) && bVar56) && bVar55) && bVar54) &&
             bVar52);
    auVar102 = auVar239._0_32_;
    auVar140 = auVar285._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }